

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O2

bool embree::sse2::InstanceArrayIntersector1MB::pointQuery
               (PointQuery *query,PointQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float (*pafVar2) [16];
  float *pfVar3;
  float *pfVar4;
  ulong uVar5;
  RTCFormat RVar6;
  InstanceArray *this;
  RawBufferView *pRVar7;
  char *pcVar8;
  RawBufferView *pRVar9;
  RTCPointQueryContext *pRVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  bool bVar13;
  undefined1 uVar14;
  uint uVar15;
  Accel *pAVar16;
  ulong uVar17;
  long lVar18;
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  float fVar19;
  float fVar20;
  float extraout_XMM0_Dc;
  undefined1 auVar21 [12];
  float extraout_XMM0_Db;
  undefined1 extraout_XMM0 [16];
  undefined1 extraout_var [12];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  float fVar26;
  undefined1 in_XMM1 [16];
  vfloat4 a0;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float in_XMM2_Da;
  float in_XMM2_Db;
  float fVar36;
  float in_XMM2_Dc;
  float fVar38;
  float in_XMM2_Dd;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar37;
  undefined1 auVar35 [16];
  float in_XMM3_Da;
  undefined1 auVar39 [12];
  float in_XMM3_Db;
  float in_XMM3_Dc;
  float in_XMM3_Dd;
  vfloat4 l02;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float in_XMM4_Da;
  float fVar42;
  float in_XMM4_Db;
  float fVar43;
  float in_XMM4_Dc;
  float fVar44;
  float in_XMM4_Dd;
  undefined1 auVar45 [12];
  float fVar47;
  undefined1 in_XMM5 [16];
  float fVar48;
  float fVar49;
  undefined1 auVar46 [16];
  float in_XMM6_Da;
  float fVar50;
  float in_XMM6_Db;
  float in_XMM6_Dc;
  float in_XMM6_Dd;
  undefined1 auVar53 [12];
  float fVar51;
  float fVar52;
  float fVar56;
  uint uVar57;
  undefined1 in_XMM7 [16];
  undefined1 auVar54 [16];
  float fVar58;
  undefined1 auVar55 [16];
  float fVar59;
  float fVar63;
  float fVar64;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float in_XMM10_Da;
  float in_XMM10_Db;
  float in_XMM10_Dc;
  float in_XMM10_Dd;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float in_XMM11_Da;
  float fVar77;
  float in_XMM11_Db;
  float fVar78;
  float in_XMM11_Dc;
  float fVar79;
  float in_XMM11_Dd;
  float in_XMM12_Da;
  float fVar80;
  float in_XMM12_Db;
  float in_XMM12_Dc;
  float in_XMM12_Dd;
  vfloat4 a0_1;
  undefined1 auVar81 [16];
  float in_XMM13_Da;
  float in_XMM13_Db;
  float in_XMM13_Dc;
  float in_XMM13_Dd;
  undefined1 in_XMM14 [16];
  undefined1 auVar82 [16];
  float in_XMM15_Da;
  float in_XMM15_Db;
  float in_XMM15_Dc;
  float in_XMM15_Dd;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_204;
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  float local_138;
  float fStack_134;
  float fStack_130;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  undefined8 local_d8;
  float local_d0;
  float local_cc;
  float local_c8;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  uint local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  Accel *local_98;
  undefined8 local_90;
  PointQuery *local_88;
  undefined4 local_80;
  PointQueryFunction local_78;
  RTCPointQueryContext *local_70;
  float local_68;
  void *local_60;
  undefined8 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  auVar53 = in_XMM7._0_12_;
  a0.field_0._0_12_ = in_XMM1._0_12_;
  auVar45 = in_XMM5._0_12_;
  this = (InstanceArray *)(context->scene->geometries).items[prim->instID_].ptr;
  fStack_204 = in_XMM12_Dc;
  pAVar16 = InstanceArray::getObject(this,(ulong)prim->primID_);
  auVar21 = extraout_XMM0._0_12_;
  if (pAVar16 == (Accel *)0x0) {
    return false;
  }
  uVar17 = (ulong)prim->primID_;
  if ((this->super_Geometry).numTimeSteps == 1) {
    pRVar7 = (this->l2w_buf).items;
    RVar6 = pRVar7->format;
    if ((this->super_Geometry).field_8.field_0x1 == '\x01') {
      if (RVar6 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
        pcVar8 = pRVar7->ptr_ofs;
        lVar18 = uVar17 * pRVar7->stride;
        in_XMM13_Db = *(float *)(pcVar8 + lVar18 + 0x10);
        in_XMM13_Da = *(float *)(pcVar8 + lVar18);
        fVar52 = *(float *)(pcVar8 + lVar18 + 8);
        in_XMM2_Da = *(float *)(pcVar8 + lVar18 + 0xc);
        in_XMM13_Dc = *(float *)(pcVar8 + lVar18 + 0x20);
        in_XMM13_Dd = 0.0;
        auVar25._4_4_ = *(undefined4 *)(pcVar8 + lVar18 + 0x14);
        auVar25._0_4_ = *(undefined4 *)(pcVar8 + lVar18 + 4);
        auVar25._8_4_ = *(undefined4 *)(pcVar8 + lVar18 + 0x24);
        auVar25._12_4_ = 0;
        fVar58 = *(float *)(pcVar8 + lVar18 + 0x18);
        fVar56 = *(float *)(pcVar8 + lVar18 + 0x28);
        in_XMM3_Dd = 0.0;
        in_XMM2_Db = *(float *)(pcVar8 + lVar18 + 0x1c);
        in_XMM2_Dc = *(float *)(pcVar8 + lVar18 + 0x2c);
        in_XMM2_Dd = 0.0;
      }
      else if (RVar6 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
        pcVar8 = pRVar7->ptr_ofs;
        lVar18 = uVar17 * pRVar7->stride;
        in_XMM13_Da = *(float *)(pcVar8 + lVar18);
        in_XMM13_Db = (float)*(undefined8 *)(pcVar8 + lVar18 + 4);
        in_XMM13_Dc = (float)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 4) >> 0x20);
        in_XMM13_Dd = 0.0;
        auVar25._4_4_ = (int)*(undefined8 *)(pcVar8 + lVar18 + 0x10);
        auVar25._0_4_ = *(undefined4 *)(pcVar8 + lVar18 + 0xc);
        auVar25._8_4_ = (int)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 0x10) >> 0x20);
        auVar25._12_4_ = 0;
        fVar52 = *(float *)(pcVar8 + lVar18 + 0x18);
        fVar58 = (float)*(undefined8 *)(pcVar8 + lVar18 + 0x1c);
        fVar56 = (float)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 0x1c) >> 0x20);
        in_XMM3_Dd = 0.0;
        in_XMM2_Da = *(float *)(pcVar8 + lVar18 + 0x24);
        in_XMM2_Db = (float)*(undefined8 *)(pcVar8 + lVar18 + 0x28);
        in_XMM2_Dc = (float)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 0x28) >> 0x20);
        in_XMM2_Dd = 0.0;
      }
      else if (RVar6 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
        pcVar8 = pRVar7->ptr_ofs;
        lVar18 = uVar17 * pRVar7->stride;
        fVar52 = *(float *)(pcVar8 + lVar18 + 0x10);
        fVar58 = *(float *)((long)(pcVar8 + lVar18 + 0x10) + 4);
        in_XMM13_Da = *(float *)(pcVar8 + lVar18);
        fVar56 = *(float *)(pcVar8 + lVar18 + 8);
        auVar25._4_4_ = *(undefined4 *)(pcVar8 + lVar18 + 4);
        auVar25._0_4_ = *(undefined4 *)(pcVar8 + lVar18 + 0xc);
        in_XMM13_Db = (float)*(undefined8 *)(pcVar8 + lVar18 + 0x34);
        in_XMM13_Dc = (float)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 0x34) >> 0x20);
        in_XMM2_Da = *(float *)(pcVar8 + lVar18 + 0x18);
        in_XMM2_Dd = *(float *)(pcVar8 + lVar18 + 0x24);
        in_XMM13_Dd = *(float *)(pcVar8 + lVar18 + 0x28);
        fVar77 = *(float *)(pcVar8 + lVar18 + 0x2c);
        in_XMM3_Dd = *(float *)(pcVar8 + lVar18 + 0x30);
        fVar79 = in_XMM3_Dd * in_XMM3_Dd +
                 fVar77 * fVar77 + in_XMM2_Dd * in_XMM2_Dd + in_XMM13_Dd * in_XMM13_Dd;
        auVar23 = rsqrtss(ZEXT416((uint)fVar79),ZEXT416((uint)fVar79));
        fVar78 = auVar23._0_4_;
        fVar78 = fVar78 * fVar78 * fVar79 * -0.5 * fVar78 + fVar78 * 1.5;
        in_XMM2_Dd = in_XMM2_Dd * fVar78;
        in_XMM13_Dd = in_XMM13_Dd * fVar78;
        in_XMM3_Dd = fVar78 * in_XMM3_Dd;
        auVar25._12_4_ = fVar77 * fVar78;
        auVar25._8_4_ = *(undefined4 *)(pcVar8 + lVar18 + 0x3c);
        in_XMM2_Dc = (float)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 0x1c) >> 0x20);
        in_XMM2_Db = (float)*(undefined8 *)(pcVar8 + lVar18 + 0x1c);
      }
      else {
        auVar25 = extraout_XMM0;
        fVar52 = in_XMM3_Da;
        fVar58 = in_XMM3_Db;
        fVar56 = in_XMM3_Dc;
        if (RVar6 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
          pcVar8 = pRVar7->ptr_ofs;
          lVar18 = uVar17 * pRVar7->stride;
          pfVar1 = (float *)(pcVar8 + lVar18);
          in_XMM13_Da = *pfVar1;
          in_XMM13_Db = pfVar1[1];
          in_XMM13_Dc = pfVar1[2];
          in_XMM13_Dd = pfVar1[3];
          auVar25 = *(undefined1 (*) [16])(pcVar8 + lVar18 + 0x10);
          pfVar1 = (float *)(pcVar8 + lVar18 + 0x20);
          fVar52 = *pfVar1;
          fVar58 = pfVar1[1];
          fVar56 = pfVar1[2];
          in_XMM3_Dd = pfVar1[3];
          pfVar1 = (float *)(pcVar8 + lVar18 + 0x30);
          in_XMM2_Da = *pfVar1;
          in_XMM2_Db = pfVar1[1];
          in_XMM2_Dc = pfVar1[2];
          in_XMM2_Dd = pfVar1[3];
        }
      }
      fVar77 = auVar25._4_4_;
      fVar78 = auVar25._12_4_;
      fVar44 = in_XMM13_Dd * fVar78 + in_XMM3_Dd * in_XMM2_Dd;
      fVar79 = in_XMM13_Dd * fVar78 - in_XMM3_Dd * in_XMM2_Dd;
      fVar43 = in_XMM2_Dd * in_XMM2_Dd - in_XMM13_Dd * in_XMM13_Dd;
      fVar36 = in_XMM2_Dd * in_XMM2_Dd + in_XMM13_Dd * in_XMM13_Dd + -fVar78 * fVar78 +
               -in_XMM3_Dd * in_XMM3_Dd;
      fVar37 = fVar78 * fVar78 + fVar43 + -in_XMM3_Dd * in_XMM3_Dd;
      fVar48 = in_XMM13_Dd * in_XMM3_Dd - fVar78 * in_XMM2_Dd;
      fVar38 = fVar78 * in_XMM2_Dd + in_XMM13_Dd * in_XMM3_Dd;
      fVar47 = fVar78 * in_XMM3_Dd + in_XMM13_Dd * in_XMM2_Dd;
      fVar42 = fVar78 * in_XMM3_Dd - in_XMM13_Dd * in_XMM2_Dd;
      fVar44 = fVar44 + fVar44;
      fVar48 = fVar48 + fVar48;
      fVar43 = in_XMM3_Dd * in_XMM3_Dd + fVar43 + -fVar78 * fVar78;
      in_XMM12_Da = fVar44 * 0.0 + fVar48 * 0.0;
      in_XMM12_Db = fVar44 * 1.0 + fVar48 * 0.0;
      fStack_204 = fVar44 * 0.0 + fVar48 * 1.0;
      in_XMM12_Dd = fVar44 * 0.0 + fVar48 * 0.0;
      in_XMM6_Da = fVar36 * 1.0 + in_XMM12_Da;
      in_XMM6_Db = fVar36 * 0.0 + in_XMM12_Db;
      in_XMM6_Dc = fVar36 * 0.0 + fStack_204;
      in_XMM6_Dd = fVar36 * 0.0 + in_XMM12_Dd;
      fVar47 = fVar47 + fVar47;
      fVar79 = fVar79 + fVar79;
      auVar45._0_4_ = fVar79 * 1.0 + fVar37 * 0.0 + fVar47 * 0.0;
      auVar45._4_4_ = fVar79 * 0.0 + fVar37 * 1.0 + fVar47 * 0.0;
      auVar45._8_4_ = fVar79 * 0.0 + fVar37 * 0.0 + fVar47 * 1.0;
      fVar78 = fVar79 * 0.0 + fVar37 * 0.0 + fVar47 * 0.0;
      fVar38 = fVar38 + fVar38;
      fVar42 = fVar42 + fVar42;
      fVar79 = fVar38 * 1.0 + fVar42 * 0.0 + fVar43 * 0.0;
      fVar36 = fVar38 * 0.0 + fVar42 * 1.0 + fVar43 * 0.0;
      fVar37 = fVar38 * 0.0 + fVar42 * 0.0 + fVar43 * 1.0;
      fVar38 = fVar38 * 0.0 + fVar42 * 0.0 + fVar43 * 0.0;
      in_XMM15_Da = in_XMM13_Db + 0.0;
      in_XMM15_Db = in_XMM13_Dc + 0.0;
      in_XMM3_Da = fVar56 * fVar79;
      in_XMM3_Db = fVar56 * fVar36;
      in_XMM3_Dc = fVar56 * fVar37;
      in_XMM3_Dd = fVar56 * fVar38;
      auVar53._0_4_ = fVar79 * 0.0;
      auVar53._4_4_ = fVar36 * 0.0;
      auVar53._8_4_ = fVar37 * 0.0;
      in_XMM4_Da = auVar45._0_4_ * 0.0 + auVar53._0_4_;
      in_XMM4_Db = auVar45._4_4_ * 0.0 + auVar53._4_4_;
      in_XMM4_Dc = auVar45._8_4_ * 0.0 + auVar53._8_4_;
      in_XMM4_Dd = fVar78 * 0.0 + fVar38 * 0.0;
      in_XMM11_Da = in_XMM13_Da * in_XMM6_Da + in_XMM4_Da;
      in_XMM11_Db = in_XMM13_Da * in_XMM6_Db + in_XMM4_Db;
      in_XMM11_Dc = in_XMM13_Da * in_XMM6_Dc + in_XMM4_Dc;
      in_XMM11_Dd = in_XMM13_Da * in_XMM6_Dd + in_XMM4_Dd;
      auVar21._0_4_ = fVar77 * auVar45._0_4_ + auVar53._0_4_;
      auVar21._4_4_ = fVar77 * auVar45._4_4_ + auVar53._4_4_;
      auVar21._8_4_ = fVar77 * auVar45._8_4_ + auVar53._8_4_;
      fVar56 = auVar25._0_4_;
      in_XMM14._0_4_ = fVar56 * in_XMM6_Da + auVar21._0_4_;
      in_XMM14._4_4_ = fVar56 * in_XMM6_Db + auVar21._4_4_;
      in_XMM14._8_4_ = fVar56 * in_XMM6_Dc + auVar21._8_4_;
      in_XMM14._12_4_ = fVar56 * in_XMM6_Dd + fVar77 * fVar78 + fVar38 * 0.0;
      in_XMM13_Da = fVar52 * in_XMM6_Da + fVar58 * auVar45._0_4_ + in_XMM3_Da;
      in_XMM13_Db = fVar52 * in_XMM6_Db + fVar58 * auVar45._4_4_ + in_XMM3_Db;
      in_XMM13_Dc = fVar52 * in_XMM6_Dc + fVar58 * auVar45._8_4_ + in_XMM3_Dc;
      in_XMM13_Dd = fVar52 * in_XMM6_Dd + fVar58 * fVar78 + in_XMM3_Dd;
      a0.field_0._0_4_ = in_XMM2_Db * auVar45._0_4_ + in_XMM2_Dc * fVar79;
      a0.field_0._4_4_ = in_XMM2_Db * auVar45._4_4_ + in_XMM2_Dc * fVar36;
      a0.field_0._8_4_ = in_XMM2_Db * auVar45._8_4_ + in_XMM2_Dc * fVar37;
      in_XMM15_Da = in_XMM2_Da * in_XMM6_Da + a0.field_0._0_4_ + in_XMM15_Da;
      in_XMM15_Db = in_XMM2_Da * in_XMM6_Db + a0.field_0._4_4_ + in_XMM15_Db;
      in_XMM15_Dc = in_XMM2_Da * in_XMM6_Dc + a0.field_0._8_4_ + auVar25._8_4_ + 0.0;
      in_XMM15_Dd = in_XMM2_Da * in_XMM6_Dd + in_XMM2_Db * fVar78 + in_XMM2_Dc * fVar38 + 0.0;
    }
    else if (RVar6 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
      pcVar8 = pRVar7->ptr_ofs;
      lVar18 = uVar17 * pRVar7->stride;
      in_XMM11_Db = *(float *)(pcVar8 + lVar18 + 0x10);
      in_XMM11_Da = *(float *)(pcVar8 + lVar18);
      in_XMM13_Da = *(float *)(pcVar8 + lVar18 + 8);
      in_XMM15_Da = *(float *)(pcVar8 + lVar18 + 0xc);
      in_XMM11_Dc = *(float *)(pcVar8 + lVar18 + 0x20);
      in_XMM11_Dd = 0.0;
      in_XMM14._4_4_ = (float)*(undefined4 *)(pcVar8 + lVar18 + 0x14);
      in_XMM14._0_4_ = (float)*(undefined4 *)(pcVar8 + lVar18 + 4);
      in_XMM14._8_4_ = (float)*(undefined4 *)(pcVar8 + lVar18 + 0x24);
      in_XMM14._12_4_ = 0.0;
      in_XMM13_Db = *(float *)(pcVar8 + lVar18 + 0x18);
      in_XMM13_Dc = *(float *)(pcVar8 + lVar18 + 0x28);
      in_XMM13_Dd = 0.0;
      in_XMM15_Db = *(float *)(pcVar8 + lVar18 + 0x1c);
      in_XMM15_Dc = *(float *)(pcVar8 + lVar18 + 0x2c);
      auVar21._4_8_ = 0;
      auVar21._0_4_ = in_XMM15_Dc;
      in_XMM15_Dd = 0.0;
    }
    else if (RVar6 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
      pcVar8 = pRVar7->ptr_ofs;
      lVar18 = uVar17 * pRVar7->stride;
      in_XMM11_Da = *(float *)(pcVar8 + lVar18);
      in_XMM11_Db = (float)*(undefined8 *)(pcVar8 + lVar18 + 4);
      in_XMM11_Dc = (float)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 4) >> 0x20);
      in_XMM11_Dd = 0.0;
      in_XMM14._4_4_ = (float)(int)*(undefined8 *)(pcVar8 + lVar18 + 0x10);
      in_XMM14._0_4_ = (float)*(undefined4 *)(pcVar8 + lVar18 + 0xc);
      in_XMM14._8_4_ = (float)(int)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 0x10) >> 0x20);
      in_XMM14._12_4_ = 0.0;
      in_XMM13_Da = *(float *)(pcVar8 + lVar18 + 0x18);
      in_XMM13_Db = (float)*(undefined8 *)(pcVar8 + lVar18 + 0x1c);
      in_XMM13_Dc = (float)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 0x1c) >> 0x20);
      in_XMM13_Dd = 0.0;
      uVar17 = *(ulong *)(pcVar8 + lVar18 + 0x28);
      auVar21._8_4_ = 0.0;
      auVar21._0_8_ = uVar17;
      in_XMM15_Da = *(float *)(pcVar8 + lVar18 + 0x24);
      in_XMM15_Db = (float)uVar17;
      in_XMM15_Dc = (float)(uVar17 >> 0x20);
      in_XMM15_Dd = 0.0;
    }
    else if (RVar6 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
      pcVar8 = pRVar7->ptr_ofs;
      lVar18 = uVar17 * pRVar7->stride;
      in_XMM13_Da = (float)*(undefined8 *)(pcVar8 + lVar18 + 0x10);
      in_XMM13_Db = (float)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 0x10) >> 0x20);
      in_XMM11_Da = *(float *)(pcVar8 + lVar18);
      in_XMM13_Dc = *(float *)(pcVar8 + lVar18 + 8);
      in_XMM3_Db = 0.0;
      in_XMM3_Dc = 0.0;
      in_XMM3_Dd = 0.0;
      in_XMM14._4_4_ = (float)*(undefined4 *)(pcVar8 + lVar18 + 4);
      in_XMM14._0_4_ = (float)*(undefined4 *)(pcVar8 + lVar18 + 0xc);
      in_XMM11_Db = (float)*(undefined8 *)(pcVar8 + lVar18 + 0x34);
      in_XMM11_Dc = (float)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 0x34) >> 0x20);
      in_XMM15_Da = *(float *)(pcVar8 + lVar18 + 0x18);
      uVar17 = *(ulong *)(pcVar8 + lVar18 + 0x1c);
      a0.field_0._8_4_ = 0.0;
      a0.field_0._0_8_ = uVar17;
      in_XMM15_Db = (float)uVar17;
      in_XMM15_Dc = (float)(uVar17 >> 0x20);
      in_XMM15_Dd = *(float *)(pcVar8 + lVar18 + 0x24);
      fVar52 = *(float *)(pcVar8 + lVar18 + 0x28);
      in_XMM4_Da = *(float *)(pcVar8 + lVar18 + 0x2c);
      in_XMM6_Da = *(float *)(pcVar8 + lVar18 + 0x30);
      in_XMM6_Db = 0.0;
      in_XMM6_Dc = 0.0;
      in_XMM6_Dd = 0.0;
      fVar58 = in_XMM6_Da * in_XMM6_Da +
               in_XMM4_Da * in_XMM4_Da + in_XMM15_Dd * in_XMM15_Dd + fVar52 * fVar52;
      auVar23 = rsqrtss(ZEXT416((uint)fVar58),ZEXT416((uint)fVar58));
      fVar56 = auVar23._0_4_;
      auVar54._4_12_ = auVar23._4_12_;
      fVar56 = fVar56 * fVar56 * fVar58 * -0.5 * fVar56 + fVar56 * 1.5;
      in_XMM15_Dd = in_XMM15_Dd * fVar56;
      auVar45._0_4_ = fVar52 * fVar56;
      in_XMM4_Da = in_XMM4_Da * fVar56;
      in_XMM4_Db = 0.0;
      in_XMM4_Dc = 0.0;
      in_XMM4_Dd = 0.0;
      auVar54._0_4_ = fVar56 * in_XMM6_Da;
      auVar53._8_4_ = in_XMM13_Dc;
      auVar53._0_8_ = auVar54._0_8_;
      auVar45._4_4_ = 0.0;
      auVar45._8_4_ = in_XMM11_Dc;
      auVar21._0_8_ = CONCAT44(in_XMM4_Da,*(undefined4 *)(pcVar8 + lVar18 + 0x3c));
      auVar21._8_4_ = 0.0;
      in_XMM14._8_8_ = auVar21._0_8_;
      in_XMM11_Dd = auVar45._0_4_;
      in_XMM13_Dd = auVar54._0_4_;
      in_XMM3_Da = in_XMM13_Dc;
    }
    else if (RVar6 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
      pcVar8 = pRVar7->ptr_ofs;
      lVar18 = uVar17 * pRVar7->stride;
      pfVar1 = (float *)(pcVar8 + lVar18);
      in_XMM11_Da = *pfVar1;
      in_XMM11_Db = pfVar1[1];
      in_XMM11_Dc = pfVar1[2];
      in_XMM11_Dd = pfVar1[3];
      in_XMM14 = *(undefined1 (*) [16])(pcVar8 + lVar18 + 0x10);
      pfVar1 = (float *)(pcVar8 + lVar18 + 0x20);
      in_XMM13_Da = *pfVar1;
      in_XMM13_Db = pfVar1[1];
      in_XMM13_Dc = pfVar1[2];
      in_XMM13_Dd = pfVar1[3];
      pfVar1 = (float *)(pcVar8 + lVar18 + 0x30);
      in_XMM15_Da = *pfVar1;
      in_XMM15_Db = pfVar1[1];
      in_XMM15_Dc = pfVar1[2];
      in_XMM15_Dd = pfVar1[3];
    }
  }
  else {
    fVar52 = (this->super_Geometry).fnumTimeSegments;
    fVar78 = 0.0;
    fVar58 = 0.0;
    fVar77 = 0.0;
    fVar56 = (this->super_Geometry).time_range.lower;
    auVar23 = ZEXT416((uint)fVar56);
    fVar36 = ((query->time - fVar56) / ((this->super_Geometry).time_range.upper - fVar56)) * fVar52;
    fVar56 = fVar52;
    fVar79 = floorf(fVar36);
    fStack_214 = 0.0;
    fStack_210 = 0.0;
    fStack_20c = 0.0;
    if (fVar52 + -1.0 <= fVar79) {
      fVar79 = fVar52 + -1.0;
    }
    auVar34._4_12_ = extraout_var;
    auVar34._0_4_ = fVar79;
    auVar27 = ZEXT812(0);
    if (0.0 <= fVar79) {
      auVar27._4_8_ = 0;
      auVar27._0_4_ = fVar79;
    }
    auVar41._12_4_ = 0;
    auVar41._0_12_ = auVar27;
    uVar15 = (uint)auVar27._0_4_;
    fVar36 = fVar36 - auVar27._0_4_;
    pRVar9 = (this->l2w_buf).items;
    pRVar7 = pRVar9 + uVar15;
    RVar6 = pRVar9[uVar15].format;
    if ((this->super_Geometry).field_8.field_0x1 == '\x01') {
      if (RVar6 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
        pcVar8 = pRVar7->ptr_ofs;
        lVar18 = pRVar7->stride * uVar17;
        in_XMM10_Db = *(float *)(pcVar8 + lVar18 + 0x10);
        in_XMM10_Da = *(float *)(pcVar8 + lVar18);
        in_XMM11_Da = *(float *)(pcVar8 + lVar18 + 4);
        fVar52 = *(float *)(pcVar8 + lVar18 + 8);
        in_XMM10_Dc = *(float *)(pcVar8 + lVar18 + 0x20);
        in_XMM11_Db = *(float *)(pcVar8 + lVar18 + 0x14);
        in_XMM11_Dc = *(float *)(pcVar8 + lVar18 + 0x24);
        fStack_214 = *(float *)(pcVar8 + lVar18 + 0x18);
        fStack_210 = *(float *)(pcVar8 + lVar18 + 0x28);
        auVar29._4_4_ = *(undefined4 *)(pcVar8 + lVar18 + 0x1c);
        auVar29._0_4_ = *(undefined4 *)(pcVar8 + lVar18 + 0xc);
        auVar29._8_4_ = *(undefined4 *)(pcVar8 + lVar18 + 0x2c);
LAB_0027c35b:
        fStack_20c = 0.0;
        in_XMM10_Dd = 0.0;
        fStack_1ec = 0.0;
        _local_1f8 = auVar29;
        in_XMM11_Dd = 0.0;
      }
      else {
        if (RVar6 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
          pcVar8 = pRVar7->ptr_ofs;
          lVar18 = pRVar7->stride * uVar17;
          in_XMM10_Da = *(float *)(pcVar8 + lVar18);
          in_XMM10_Db = (float)*(undefined8 *)(pcVar8 + lVar18 + 4);
          in_XMM10_Dc = (float)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 4) >> 0x20);
          in_XMM11_Da = *(float *)(pcVar8 + lVar18 + 0xc);
          in_XMM11_Db = (float)*(undefined8 *)(pcVar8 + lVar18 + 0x10);
          in_XMM11_Dc = (float)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 0x10) >> 0x20);
          fVar52 = *(float *)(pcVar8 + lVar18 + 0x18);
          fStack_214 = (float)*(undefined8 *)(pcVar8 + lVar18 + 0x1c);
          fStack_210 = (float)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 0x1c) >> 0x20);
          auVar29._4_4_ = (int)*(undefined8 *)(pcVar8 + lVar18 + 0x28);
          auVar29._0_4_ = *(undefined4 *)(pcVar8 + lVar18 + 0x24);
          auVar29._8_4_ = (int)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 0x28) >> 0x20);
          goto LAB_0027c35b;
        }
        if (RVar6 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
          pcVar8 = pRVar7->ptr_ofs;
          lVar18 = pRVar7->stride * uVar17;
          fVar52 = *(float *)(pcVar8 + lVar18 + 0x10);
          fStack_214 = *(float *)((long)(pcVar8 + lVar18 + 0x10) + 4);
          in_XMM10_Da = *(float *)(pcVar8 + lVar18);
          in_XMM11_Db = *(float *)(pcVar8 + lVar18 + 4);
          fStack_210 = *(float *)(pcVar8 + lVar18 + 8);
          in_XMM11_Da = *(float *)(pcVar8 + lVar18 + 0xc);
          in_XMM13_Da = *(float *)(pcVar8 + lVar18 + 0x18);
          in_XMM13_Db = (float)*(undefined8 *)(pcVar8 + lVar18 + 0x1c);
          in_XMM13_Dc = (float)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 0x1c) >> 0x20);
          in_XMM13_Dd = *(float *)(pcVar8 + lVar18 + 0x24);
          in_XMM10_Dd = *(float *)(pcVar8 + lVar18 + 0x28);
          in_XMM11_Dd = *(float *)(pcVar8 + lVar18 + 0x2c);
          fVar56 = *(float *)(pcVar8 + lVar18 + 0x30);
          fVar77 = fVar56 * fVar56 +
                   in_XMM11_Dd * in_XMM11_Dd + in_XMM13_Dd * in_XMM13_Dd + in_XMM10_Dd * in_XMM10_Dd
          ;
          auVar23 = rsqrtss(ZEXT416((uint)fVar77),ZEXT416((uint)fVar77));
          fVar58 = auVar23._0_4_;
          fStack_20c = fVar58 * fVar58 * fVar77 * -0.5 * fVar58 + fVar58 * 1.5;
          in_XMM13_Dd = in_XMM13_Dd * fStack_20c;
          in_XMM10_Dd = in_XMM10_Dd * fStack_20c;
          in_XMM11_Dd = in_XMM11_Dd * fStack_20c;
          fStack_20c = fStack_20c * fVar56;
          in_XMM10_Db = (float)*(undefined8 *)(pcVar8 + lVar18 + 0x34);
          in_XMM10_Dc = (float)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 0x34) >> 0x20);
          in_XMM11_Dc = *(float *)(pcVar8 + lVar18 + 0x3c);
          fVar78 = 0.0;
          fVar77 = 0.0;
          local_1f8._4_4_ = in_XMM13_Db;
          local_1f8._0_4_ = in_XMM13_Da;
          fStack_1f0 = in_XMM13_Dc;
          fStack_1ec = in_XMM13_Dd;
          fVar56 = in_XMM13_Dd;
          fVar58 = in_XMM13_Dc;
        }
        else {
          fVar52 = fVar36;
          if (RVar6 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
            pcVar8 = pRVar7->ptr_ofs;
            lVar18 = pRVar7->stride * uVar17;
            pfVar1 = (float *)(pcVar8 + lVar18);
            in_XMM10_Da = *pfVar1;
            in_XMM10_Db = pfVar1[1];
            in_XMM10_Dc = pfVar1[2];
            in_XMM10_Dd = pfVar1[3];
            pfVar1 = (float *)(pcVar8 + lVar18 + 0x10);
            in_XMM11_Da = *pfVar1;
            in_XMM11_Db = pfVar1[1];
            in_XMM11_Dc = pfVar1[2];
            in_XMM11_Dd = pfVar1[3];
            pfVar1 = (float *)(pcVar8 + lVar18 + 0x20);
            fVar52 = *pfVar1;
            fStack_214 = pfVar1[1];
            fStack_210 = pfVar1[2];
            fStack_20c = pfVar1[3];
            _local_1f8 = *(undefined1 (*) [16])(pcVar8 + lVar18 + 0x30);
          }
        }
      }
      pRVar7 = pRVar9 + (uVar15 + 1);
      RVar6 = pRVar9[uVar15 + 1].format;
      if (RVar6 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
        pcVar8 = pRVar7->ptr_ofs;
        lVar18 = uVar17 * pRVar7->stride;
        in_XMM13_Db = *(float *)(pcVar8 + lVar18 + 0x10);
        in_XMM13_Da = *(float *)(pcVar8 + lVar18);
        in_XMM15_Da = *(float *)(pcVar8 + lVar18 + 4);
        fVar56 = *(float *)(pcVar8 + lVar18 + 0xc);
        in_XMM13_Dc = *(float *)(pcVar8 + lVar18 + 0x20);
        in_XMM13_Dd = 0.0;
        in_XMM15_Db = *(float *)(pcVar8 + lVar18 + 0x14);
        in_XMM15_Dc = *(float *)(pcVar8 + lVar18 + 0x24);
        in_XMM15_Dd = 0.0;
        in_XMM14._4_4_ = (float)*(undefined4 *)(pcVar8 + lVar18 + 0x18);
        in_XMM14._0_4_ = (float)*(undefined4 *)(pcVar8 + lVar18 + 8);
        in_XMM14._8_4_ = (float)*(undefined4 *)(pcVar8 + lVar18 + 0x28);
        in_XMM14._12_4_ = 0.0;
        fVar78 = *(float *)(pcVar8 + lVar18 + 0x1c);
        fVar58 = *(float *)(pcVar8 + lVar18 + 0x2c);
        fVar77 = 0.0;
      }
      else if (RVar6 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
        pcVar8 = pRVar7->ptr_ofs;
        lVar18 = uVar17 * pRVar7->stride;
        in_XMM13_Da = *(float *)(pcVar8 + lVar18);
        in_XMM13_Db = (float)*(undefined8 *)(pcVar8 + lVar18 + 4);
        in_XMM13_Dc = (float)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 4) >> 0x20);
        in_XMM13_Dd = 0.0;
        in_XMM15_Da = *(float *)(pcVar8 + lVar18 + 0xc);
        in_XMM15_Db = (float)*(undefined8 *)(pcVar8 + lVar18 + 0x10);
        in_XMM15_Dc = (float)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 0x10) >> 0x20);
        in_XMM15_Dd = 0.0;
        in_XMM14._4_4_ = (float)(int)*(undefined8 *)(pcVar8 + lVar18 + 0x1c);
        in_XMM14._0_4_ = (float)*(undefined4 *)(pcVar8 + lVar18 + 0x18);
        in_XMM14._8_4_ = (float)(int)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 0x1c) >> 0x20);
        in_XMM14._12_4_ = 0.0;
        fVar56 = *(float *)(pcVar8 + lVar18 + 0x24);
        fVar78 = (float)*(undefined8 *)(pcVar8 + lVar18 + 0x28);
        fVar58 = (float)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 0x28) >> 0x20);
        fVar77 = 0.0;
      }
      else if (RVar6 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
        pcVar8 = pRVar7->ptr_ofs;
        lVar18 = uVar17 * pRVar7->stride;
        in_XMM13_Da = *(float *)(pcVar8 + lVar18);
        in_XMM15_Db = *(float *)(pcVar8 + lVar18 + 4);
        in_XMM15_Da = *(float *)(pcVar8 + lVar18 + 0xc);
        in_XMM13_Db = (float)*(undefined8 *)(pcVar8 + lVar18 + 0x34);
        in_XMM13_Dc = (float)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 0x34) >> 0x20);
        fVar56 = *(float *)(pcVar8 + lVar18 + 0x18);
        fVar77 = *(float *)(pcVar8 + lVar18 + 0x24);
        in_XMM13_Dd = *(float *)(pcVar8 + lVar18 + 0x28);
        in_XMM15_Dd = *(float *)(pcVar8 + lVar18 + 0x2c);
        fVar58 = *(float *)(pcVar8 + lVar18 + 0x30);
        fVar79 = fVar58 * fVar58 +
                 in_XMM15_Dd * in_XMM15_Dd + fVar77 * fVar77 + in_XMM13_Dd * in_XMM13_Dd;
        auVar23 = rsqrtss(ZEXT416((uint)fVar79),ZEXT416((uint)fVar79));
        fVar78 = auVar23._0_4_;
        fVar78 = fVar78 * fVar78 * fVar79 * -0.5 * fVar78 + fVar78 * 1.5;
        fVar77 = fVar77 * fVar78;
        in_XMM13_Dd = in_XMM13_Dd * fVar78;
        in_XMM15_Dd = in_XMM15_Dd * fVar78;
        in_XMM14._8_4_ = (float)*(undefined4 *)(pcVar8 + lVar18 + 8);
        in_XMM14._0_8_ = *(undefined8 *)(pcVar8 + lVar18 + 0x10);
        in_XMM14._12_4_ = fVar78 * fVar58;
        in_XMM15_Dc = *(float *)(pcVar8 + lVar18 + 0x3c);
        fVar58 = (float)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 0x1c) >> 0x20);
        fVar78 = (float)*(undefined8 *)(pcVar8 + lVar18 + 0x1c);
      }
      else if (RVar6 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
        pcVar8 = pRVar7->ptr_ofs;
        lVar18 = uVar17 * pRVar7->stride;
        pfVar1 = (float *)(pcVar8 + lVar18);
        in_XMM13_Da = *pfVar1;
        in_XMM13_Db = pfVar1[1];
        in_XMM13_Dc = pfVar1[2];
        in_XMM13_Dd = pfVar1[3];
        pfVar1 = (float *)(pcVar8 + lVar18 + 0x10);
        in_XMM15_Da = *pfVar1;
        in_XMM15_Db = pfVar1[1];
        in_XMM15_Dc = pfVar1[2];
        in_XMM15_Dd = pfVar1[3];
        in_XMM14 = *(undefined1 (*) [16])(pcVar8 + lVar18 + 0x20);
        pfVar1 = (float *)(pcVar8 + lVar18 + 0x30);
        fVar56 = *pfVar1;
        fVar78 = pfVar1[1];
        fVar58 = pfVar1[2];
        fVar77 = pfVar1[3];
      }
      fVar37 = in_XMM14._12_4_;
      fVar38 = fStack_20c * fVar37 +
               in_XMM11_Dd * in_XMM15_Dd + fVar77 * fStack_1ec + in_XMM10_Dd * in_XMM13_Dd;
      fVar79 = -fVar38;
      fStack_1b0 = -fStack_20c;
      fStack_1ac = -fStack_20c;
      if (fVar38 < fVar79) {
        in_XMM15_Dd = -in_XMM15_Dd;
      }
      fVar43 = ABS(fVar38);
      fVar42 = fVar79;
      if (fVar79 <= fVar38) {
        fVar42 = fVar38;
      }
      fVar44 = 1.0 - fVar43;
      local_1b8 = (undefined1  [8])(CONCAT44(fStack_20c,fVar42) ^ 0x8000000000000000);
      auVar23 = _local_1b8;
      if (fVar44 < 0.0) {
        fVar44 = sqrtf(fVar44);
      }
      else {
        fVar44 = SQRT(fVar44);
      }
      fVar37 = (float)(~-(uint)(fVar38 < fVar79) & (uint)fVar37 |
                      (uint)-fVar37 & -(uint)(fVar38 < fVar79));
      fVar44 = 1.5707964 -
               fVar44 * (((((fVar43 * -0.0043095737 + 0.0192803) * fVar43 + -0.04489909) * fVar43 +
                          0.08785567) * fVar43 + -0.21450998) * fVar43 + 1.5707952);
      fVar79 = 0.0;
      if (0.0 <= fVar44) {
        fVar79 = fVar44;
      }
      fVar47 = (float)(-(uint)(1.0 < fVar43) & 0x7fc00000 |
                      ~-(uint)(1.0 < fVar43) &
                      (uint)(1.5707964 -
                            (float)((uint)-fVar79 & -(uint)(fVar42 < 0.0) |
                                   ~-(uint)(fVar42 < 0.0) & (uint)fVar79))) * fVar36;
      fVar44 = floorf(fVar47 * 0.63661975);
      fVar47 = fVar47 - fVar44 * 1.5707964;
      fVar43 = fVar47 * fVar47;
      uVar15 = (int)fVar44 & 3;
      fVar79 = ((((fVar43 * -2.5963018e-07 + 2.4756235e-05) * fVar43 + -0.001388833) * fVar43 +
                0.04166664) * fVar43 + -0.5) * fVar43 + 1.0;
      fVar47 = (((((fVar43 * -2.5029328e-08 + 2.7600126e-06) * fVar43 + -0.00019842605) * fVar43 +
                 0.008333348) * fVar43 + -0.16666667) * fVar43 + 1.0) * fVar47;
      fVar43 = fVar47;
      if (((int)fVar44 & 1U) != 0) {
        fVar43 = fVar79;
        fVar79 = fVar47;
      }
      if (uVar15 - 1 < 2) {
        fVar79 = -fVar79;
      }
      fVar47 = fVar42 * in_XMM11_Dd - in_XMM15_Dd;
      fVar44 = fVar42 * fStack_20c - fVar37;
      if (uVar15 < 2) {
        fVar43 = -fVar43;
      }
      fVar48 = 1.0 - fVar36;
      fVar49 = fVar48 * in_XMM11_Dd + in_XMM15_Dd * fVar36;
      fVar37 = fVar48 * fStack_20c + fVar37 * fVar36;
      uVar15 = (int)((uint)(fVar38 < 0.0) << 0x1f) >> 0x1f;
      uVar57 = (int)((uint)(fVar38 < 0.0) << 0x1f) >> 0x1f;
      fVar51 = (float)((uint)-fVar77 & uVar15 | ~uVar15 & (uint)fVar77);
      fVar63 = (float)((uint)-in_XMM13_Dd & uVar57 | ~uVar57 & (uint)in_XMM13_Dd);
      fVar77 = fVar42 * fStack_1ec - fVar51;
      fVar38 = fVar42 * in_XMM10_Dd - fVar63;
      auVar73._4_4_ = local_1b8._4_4_;
      auVar73._0_4_ = fVar44;
      auVar73._8_4_ = fStack_1b0;
      auVar73._12_4_ = fStack_1ac;
      auVar74._4_12_ = auVar73._4_12_;
      auVar74._0_4_ = fVar44 * fVar44 + fVar47 * fVar47 + fVar77 * fVar77 + fVar38 * fVar38;
      auVar61._4_4_ = local_1b8._4_4_;
      auVar61._0_4_ = auVar74._0_4_;
      auVar61._8_4_ = fStack_1b0;
      auVar61._12_4_ = fStack_1ac;
      auVar34 = rsqrtss(auVar61,auVar74);
      fVar50 = auVar34._0_4_;
      fVar65 = fVar50 * fVar50 * auVar74._0_4_ * -0.5 * fVar50 + fVar50 * 1.5;
      fVar50 = fStack_1ec * fVar48 + fVar51 * fVar36;
      fVar51 = in_XMM10_Dd * fVar48 + fVar63 * fVar36;
      fVar64 = fVar37 * fVar37 + fVar49 * fVar49 + fVar50 * fVar50 + fVar51 * fVar51;
      auVar34 = rsqrtss(ZEXT416((uint)fVar64),ZEXT416((uint)fVar64));
      fVar63 = auVar34._0_4_;
      fVar63 = fVar63 * fVar63 * fVar64 * -0.5 * fVar63 + fVar63 * 1.5;
      uVar15 = (int)((uint)(0.9995 < fVar42) << 0x1f) >> 0x1f;
      uVar57 = (int)((uint)(0.9995 < fVar42) << 0x1f) >> 0x1f;
      fVar77 = (float)(~uVar15 & (uint)(fVar79 * fStack_1ec + fVar43 * fVar65 * fVar77) |
                      (uint)(fVar63 * fVar50) & uVar15);
      fVar38 = (float)(~uVar57 & (uint)(fVar79 * in_XMM10_Dd + fVar43 * fVar65 * fVar38) |
                      (uint)(fVar63 * fVar51) & uVar57);
      if (0.9995 < fVar42) {
        fVar49 = fVar49 * fVar63;
        fVar37 = fVar37 * fVar63;
      }
      else {
        fVar49 = in_XMM11_Dd * fVar79 + fVar47 * fVar65 * fVar43;
        fVar37 = fStack_20c * fVar79 + fVar44 * fVar65 * fVar43;
      }
      fVar43 = in_XMM13_Db * fVar36;
      fVar47 = in_XMM13_Dc * fVar36;
      fVar79 = in_XMM10_Da * fVar48 + in_XMM13_Da * fVar36;
      fVar50 = in_XMM11_Dc * fVar48;
      fVar42 = in_XMM11_Da * fVar48 + in_XMM15_Da * fVar36;
      fVar44 = in_XMM11_Db * fVar48 + in_XMM15_Db * fVar36;
      local_138 = in_XMM14._0_4_;
      fStack_134 = in_XMM14._4_4_;
      fStack_130 = in_XMM14._8_4_;
      fVar51 = fVar52 * fVar48 + local_138 * fVar36;
      fVar65 = fStack_214 * fVar48 + fStack_134 * fVar36;
      in_XMM3_Dd = fStack_210 * fVar48 + fStack_130 * fVar36;
      fVar63 = (float)local_1f8._0_4_ * fVar48 + fVar56 * fVar36;
      fVar78 = (float)local_1f8._4_4_ * fVar48 + fVar78 * fVar36;
      fVar64 = fStack_1f0 * fVar48 + fVar58 * fVar36;
      fVar68 = fVar38 * fVar49 + fVar77 * fVar37;
      fVar58 = fVar38 * fVar49 - fVar77 * fVar37;
      fVar56 = fVar77 * fVar77 + fVar38 * fVar38 + -fVar49 * fVar49 + -fVar37 * fVar37;
      fVar70 = fVar77 * fVar77 - fVar38 * fVar38;
      fVar69 = fVar49 * fVar49 + fVar70 + -fVar37 * fVar37;
      fVar20 = fVar38 * fVar37 - fVar77 * fVar49;
      fVar66 = fVar77 * fVar49 + fVar38 * fVar37;
      fVar19 = fVar49 * fVar37 + fVar77 * fVar38;
      fVar52 = fVar49 * fVar37 - fVar77 * fVar38;
      fVar68 = fVar68 + fVar68;
      fVar20 = fVar20 + fVar20;
      fVar77 = fVar37 * fVar37 + fVar70 + -fVar49 * fVar49;
      in_XMM12_Da = 0.0;
      in_XMM12_Db = 0.0;
      fStack_204 = 1.0;
      in_XMM12_Dd = 0.0;
      in_XMM4_Da = fVar56 * 1.0 + fVar68 * 0.0 + fVar20 * 0.0;
      in_XMM4_Db = fVar56 * 0.0 + fVar68 * 1.0 + fVar20 * 0.0;
      in_XMM4_Dc = fVar56 * 0.0 + fVar68 * 0.0 + fVar20 * 1.0;
      in_XMM4_Dd = fVar56 * 0.0 + fVar68 * 0.0 + fVar20 * 0.0;
      fVar19 = fVar19 + fVar19;
      fVar58 = fVar58 + fVar58;
      auVar45._0_4_ = fVar58 * 1.0 + fVar69 * 0.0 + fVar19 * 0.0;
      auVar45._4_4_ = fVar58 * 0.0 + fVar69 * 1.0 + fVar19 * 0.0;
      auVar45._8_4_ = fVar58 * 0.0 + fVar69 * 0.0 + fVar19 * 1.0;
      fVar56 = fVar58 * 0.0 + fVar69 * 0.0 + fVar19 * 0.0;
      fVar66 = fVar66 + fVar66;
      fVar52 = fVar52 + fVar52;
      in_XMM6_Da = fVar66 * 1.0 + fVar52 * 0.0 + fVar77 * 0.0;
      in_XMM6_Db = fVar66 * 0.0 + fVar52 * 1.0 + fVar77 * 0.0;
      in_XMM6_Dc = fVar66 * 0.0 + fVar52 * 0.0 + fVar77 * 1.0;
      fVar52 = fVar66 * 0.0 + fVar52 * 0.0 + fVar77 * 0.0;
      in_XMM3_Da = in_XMM3_Dd * in_XMM6_Da;
      in_XMM3_Db = in_XMM3_Dd * in_XMM6_Db;
      in_XMM3_Dc = in_XMM3_Dd * in_XMM6_Dc;
      in_XMM3_Dd = in_XMM3_Dd * fVar52;
      auVar53._0_4_ = fVar64 * in_XMM6_Da;
      auVar53._4_4_ = fVar64 * in_XMM6_Db;
      auVar53._8_4_ = fVar64 * in_XMM6_Dc;
      in_XMM6_Da = in_XMM6_Da * 0.0;
      in_XMM6_Db = in_XMM6_Db * 0.0;
      in_XMM6_Dc = in_XMM6_Dc * 0.0;
      in_XMM6_Dd = fVar52 * 0.0;
      in_XMM11_Da = fVar79 * in_XMM4_Da + auVar45._0_4_ * 0.0 + in_XMM6_Da;
      in_XMM11_Db = fVar79 * in_XMM4_Db + auVar45._4_4_ * 0.0 + in_XMM6_Db;
      in_XMM11_Dc = fVar79 * in_XMM4_Dc + auVar45._8_4_ * 0.0 + in_XMM6_Dc;
      in_XMM11_Dd = fVar79 * in_XMM4_Dd + fVar56 * 0.0 + in_XMM6_Dd;
      in_XMM14._0_4_ = fVar42 * in_XMM4_Da + fVar44 * auVar45._0_4_ + in_XMM6_Da;
      in_XMM14._4_4_ = fVar42 * in_XMM4_Db + fVar44 * auVar45._4_4_ + in_XMM6_Db;
      in_XMM14._8_4_ = fVar42 * in_XMM4_Dc + fVar44 * auVar45._8_4_ + in_XMM6_Dc;
      in_XMM14._12_4_ = fVar42 * in_XMM4_Dd + fVar44 * fVar56 + in_XMM6_Dd;
      auVar21._0_4_ = fVar65 * auVar45._0_4_ + in_XMM3_Da;
      auVar21._4_4_ = fVar65 * auVar45._4_4_ + in_XMM3_Db;
      auVar21._8_4_ = fVar65 * auVar45._8_4_ + in_XMM3_Dc;
      in_XMM13_Da = fVar51 * in_XMM4_Da + auVar21._0_4_;
      in_XMM13_Db = fVar51 * in_XMM4_Db + auVar21._4_4_;
      in_XMM13_Dc = fVar51 * in_XMM4_Dc + auVar21._8_4_;
      in_XMM13_Dd = fVar51 * in_XMM4_Dd + fVar65 * fVar56 + in_XMM3_Dd;
      a0.field_0._0_4_ = fVar78 * auVar45._0_4_ + auVar53._0_4_;
      a0.field_0._4_4_ = fVar78 * auVar45._4_4_ + auVar53._4_4_;
      a0.field_0._8_4_ = fVar78 * auVar45._8_4_ + auVar53._8_4_;
      in_XMM15_Da = fVar63 * in_XMM4_Da + a0.field_0._0_4_ + in_XMM10_Db * fVar48 + fVar43 + 0.0;
      in_XMM15_Db = fVar63 * in_XMM4_Db + a0.field_0._4_4_ + in_XMM10_Dc * fVar48 + fVar47 + 0.0;
      in_XMM15_Dc = fVar63 * in_XMM4_Dc + a0.field_0._8_4_ + fVar50 + in_XMM15_Dc * fVar36 + 0.0;
      in_XMM15_Dd = fVar63 * in_XMM4_Dd + fVar78 * fVar56 + fVar64 * fVar52 + 0.0;
      _local_1b8 = auVar23;
    }
    else {
      if (RVar6 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
        pcVar8 = pRVar7->ptr_ofs;
        lVar18 = pRVar7->stride * uVar17;
        in_XMM11_Db = *(float *)(pcVar8 + lVar18 + 0x10);
        in_XMM11_Da = *(float *)(pcVar8 + lVar18);
        in_XMM13_Da = *(float *)(pcVar8 + lVar18 + 8);
        in_XMM11_Dc = *(float *)(pcVar8 + lVar18 + 0x20);
        in_XMM11_Dd = 0.0;
        in_XMM14._4_4_ = (float)*(undefined4 *)(pcVar8 + lVar18 + 0x14);
        in_XMM14._0_4_ = (float)*(undefined4 *)(pcVar8 + lVar18 + 4);
        in_XMM14._8_4_ = (float)*(undefined4 *)(pcVar8 + lVar18 + 0x24);
        in_XMM14._12_4_ = 0.0;
        in_XMM13_Db = *(float *)(pcVar8 + lVar18 + 0x18);
        in_XMM13_Dc = *(float *)(pcVar8 + lVar18 + 0x28);
        in_XMM13_Dd = 0.0;
        auVar34._4_4_ = *(undefined4 *)(pcVar8 + lVar18 + 0x1c);
        auVar34._0_4_ = *(undefined4 *)(pcVar8 + lVar18 + 0xc);
        auVar41 = ZEXT416(*(uint *)(pcVar8 + lVar18 + 0x2c));
        auVar34._8_4_ = *(uint *)(pcVar8 + lVar18 + 0x2c);
        auVar34._12_4_ = 0;
      }
      else if (RVar6 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
        pcVar8 = pRVar7->ptr_ofs;
        lVar18 = pRVar7->stride * uVar17;
        in_XMM11_Da = *(float *)(pcVar8 + lVar18);
        in_XMM11_Db = (float)*(undefined8 *)(pcVar8 + lVar18 + 4);
        in_XMM11_Dc = (float)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 4) >> 0x20);
        in_XMM11_Dd = 0.0;
        in_XMM14._4_4_ = (float)(int)*(undefined8 *)(pcVar8 + lVar18 + 0x10);
        in_XMM14._0_4_ = (float)*(undefined4 *)(pcVar8 + lVar18 + 0xc);
        in_XMM14._8_4_ = (float)(int)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 0x10) >> 0x20);
        in_XMM14._12_4_ = 0.0;
        in_XMM13_Da = *(float *)(pcVar8 + lVar18 + 0x18);
        in_XMM13_Db = (float)*(undefined8 *)(pcVar8 + lVar18 + 0x1c);
        in_XMM13_Dc = (float)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 0x1c) >> 0x20);
        in_XMM13_Dd = 0.0;
        uVar5 = *(ulong *)(pcVar8 + lVar18 + 0x28);
        auVar41._8_8_ = 0;
        auVar41._0_8_ = uVar5;
        auVar34._4_4_ = (int)uVar5;
        auVar34._0_4_ = *(undefined4 *)(pcVar8 + lVar18 + 0x24);
        auVar34._8_4_ = (int)(uVar5 >> 0x20);
        auVar34._12_4_ = 0;
      }
      else if (RVar6 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
        pcVar8 = pRVar7->ptr_ofs;
        lVar18 = pRVar7->stride * uVar17;
        in_XMM13_Da = (float)*(undefined8 *)(pcVar8 + lVar18 + 0x10);
        in_XMM13_Db = (float)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 0x10) >> 0x20);
        in_XMM11_Da = *(float *)(pcVar8 + lVar18);
        in_XMM13_Dc = *(float *)(pcVar8 + lVar18 + 8);
        in_XMM4_Db = 0.0;
        in_XMM4_Dc = 0.0;
        in_XMM4_Dd = 0.0;
        in_XMM14._4_4_ = (float)*(undefined4 *)(pcVar8 + lVar18 + 4);
        in_XMM14._0_4_ = (float)*(undefined4 *)(pcVar8 + lVar18 + 0xc);
        in_XMM11_Db = (float)*(undefined8 *)(pcVar8 + lVar18 + 0x34);
        in_XMM11_Dc = (float)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 0x34) >> 0x20);
        fVar56 = *(float *)(pcVar8 + lVar18 + 0x1c);
        fVar78 = *(float *)((long)(pcVar8 + lVar18 + 0x1c) + 4);
        fVar58 = 0.0;
        fVar77 = 0.0;
        fVar52 = *(float *)(pcVar8 + lVar18 + 0x24);
        in_XMM11_Dd = *(float *)(pcVar8 + lVar18 + 0x28);
        fVar79 = *(float *)(pcVar8 + lVar18 + 0x2c);
        fVar38 = *(float *)(pcVar8 + lVar18 + 0x30);
        auVar53._4_8_ = 0;
        auVar53._0_4_ = fVar38;
        fVar42 = fVar38 * fVar38 + fVar79 * fVar79 + fVar52 * fVar52 + in_XMM11_Dd * in_XMM11_Dd;
        auVar23 = rsqrtss(ZEXT416((uint)fVar42),ZEXT416((uint)fVar42));
        fVar37 = auVar23._0_4_;
        in_XMM13_Dd = fVar37 * fVar37 * fVar42 * -0.5 * fVar37 + fVar37 * 1.5;
        auVar23._0_4_ = fVar52 * in_XMM13_Dd;
        in_XMM11_Dd = in_XMM11_Dd * in_XMM13_Dd;
        auVar45._0_4_ = fVar79 * in_XMM13_Dd;
        auVar45._4_8_ = 0;
        in_XMM13_Dd = in_XMM13_Dd * fVar38;
        in_XMM6_Db = 0.0;
        in_XMM6_Dd = 0.0;
        auVar41._0_8_ = CONCAT44(auVar45._0_4_,*(undefined4 *)(pcVar8 + lVar18 + 0x3c));
        auVar41._8_8_ = 0;
        in_XMM14._8_8_ = auVar41._0_8_;
        auVar23._4_4_ = 0;
        auVar23._8_4_ = fVar78;
        auVar23._12_4_ = 0;
        auVar34._4_4_ = fVar56;
        auVar34._0_4_ = *(undefined4 *)(pcVar8 + lVar18 + 0x18);
        auVar34._8_4_ = fVar78;
        auVar34._12_4_ = auVar23._0_4_;
        in_XMM4_Da = in_XMM13_Dc;
        in_XMM6_Da = in_XMM11_Dd;
        in_XMM6_Dc = in_XMM11_Dc;
      }
      else if (RVar6 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
        pcVar8 = pRVar7->ptr_ofs;
        lVar18 = pRVar7->stride * uVar17;
        pfVar1 = (float *)(pcVar8 + lVar18);
        in_XMM11_Da = *pfVar1;
        in_XMM11_Db = pfVar1[1];
        in_XMM11_Dc = pfVar1[2];
        in_XMM11_Dd = pfVar1[3];
        in_XMM14 = *(undefined1 (*) [16])(pcVar8 + lVar18 + 0x10);
        pfVar1 = (float *)(pcVar8 + lVar18 + 0x20);
        in_XMM13_Da = *pfVar1;
        in_XMM13_Db = pfVar1[1];
        in_XMM13_Dc = pfVar1[2];
        in_XMM13_Dd = pfVar1[3];
        auVar34 = *(undefined1 (*) [16])(pcVar8 + lVar18 + 0x30);
      }
      auVar21 = auVar34._0_12_;
      pRVar7 = pRVar9 + (uVar15 + 1);
      RVar6 = pRVar9[uVar15 + 1].format;
      if (RVar6 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
        pcVar8 = pRVar7->ptr_ofs;
        lVar18 = uVar17 * pRVar7->stride;
        auVar41._4_4_ = *(undefined4 *)(pcVar8 + lVar18 + 0x10);
        auVar41._0_4_ = *(undefined4 *)(pcVar8 + lVar18);
        fVar56 = *(float *)(pcVar8 + lVar18 + 8);
        in_XMM4_Da = *(float *)(pcVar8 + lVar18 + 0xc);
        auVar41._8_4_ = *(undefined4 *)(pcVar8 + lVar18 + 0x20);
        auVar41._12_4_ = 0;
        auVar23._4_4_ = *(undefined4 *)(pcVar8 + lVar18 + 0x14);
        auVar23._0_4_ = (float)*(undefined4 *)(pcVar8 + lVar18 + 4);
        auVar23._8_4_ = *(undefined4 *)(pcVar8 + lVar18 + 0x24);
        auVar23._12_4_ = 0;
        fVar78 = *(float *)(pcVar8 + lVar18 + 0x18);
        fVar58 = *(float *)(pcVar8 + lVar18 + 0x28);
        fVar77 = 0.0;
        in_XMM4_Db = *(float *)(pcVar8 + lVar18 + 0x1c);
        in_XMM4_Dc = *(float *)(pcVar8 + lVar18 + 0x2c);
        auVar45._4_8_ = 0;
        auVar45._0_4_ = in_XMM4_Dc;
        in_XMM4_Dd = 0.0;
      }
      else if (RVar6 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
        pcVar8 = pRVar7->ptr_ofs;
        lVar18 = uVar17 * pRVar7->stride;
        auVar41._4_4_ = (int)*(undefined8 *)(pcVar8 + lVar18 + 4);
        auVar41._0_4_ = *(undefined4 *)(pcVar8 + lVar18);
        auVar41._8_4_ = (int)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 4) >> 0x20);
        auVar41._12_4_ = 0;
        auVar23._4_4_ = (int)*(undefined8 *)(pcVar8 + lVar18 + 0x10);
        auVar23._0_4_ = (float)*(undefined4 *)(pcVar8 + lVar18 + 0xc);
        auVar23._8_4_ = (int)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 0x10) >> 0x20);
        auVar23._12_4_ = 0;
        fVar56 = *(float *)(pcVar8 + lVar18 + 0x18);
        fVar78 = (float)*(undefined8 *)(pcVar8 + lVar18 + 0x1c);
        fVar58 = (float)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 0x1c) >> 0x20);
        fVar77 = 0.0;
        uVar17 = *(ulong *)(pcVar8 + lVar18 + 0x28);
        auVar45._8_4_ = 0.0;
        auVar45._0_8_ = uVar17;
        in_XMM4_Da = *(float *)(pcVar8 + lVar18 + 0x24);
        in_XMM4_Db = (float)uVar17;
        in_XMM4_Dc = (float)(uVar17 >> 0x20);
        in_XMM4_Dd = 0.0;
      }
      else if (RVar6 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
        pcVar8 = pRVar7->ptr_ofs;
        lVar18 = uVar17 * pRVar7->stride;
        fVar56 = *(float *)(pcVar8 + lVar18 + 0x10);
        fVar78 = *(float *)((long)(pcVar8 + lVar18 + 0x10) + 4);
        fVar58 = *(float *)(pcVar8 + lVar18 + 8);
        auVar23._4_4_ = *(undefined4 *)(pcVar8 + lVar18 + 4);
        auVar23._0_4_ = (float)*(undefined4 *)(pcVar8 + lVar18 + 0xc);
        in_XMM4_Da = *(float *)(pcVar8 + lVar18 + 0x18);
        in_XMM4_Db = *(float *)(pcVar8 + lVar18 + 0x1c);
        in_XMM4_Dc = *(float *)((long)(pcVar8 + lVar18 + 0x1c) + 4);
        in_XMM6_Dc = 0.0;
        in_XMM6_Dd = 0.0;
        fVar52 = *(float *)(pcVar8 + lVar18 + 0x24);
        fVar79 = *(float *)(pcVar8 + lVar18 + 0x28);
        fVar38 = *(float *)(pcVar8 + lVar18 + 0x2c);
        fVar77 = *(float *)(pcVar8 + lVar18 + 0x30);
        fVar42 = fVar77 * fVar77 + fVar38 * fVar38 + fVar52 * fVar52 + fVar79 * fVar79;
        auVar41 = rsqrtss(ZEXT416((uint)fVar42),ZEXT416((uint)fVar42));
        fVar37 = auVar41._0_4_;
        fVar37 = fVar37 * fVar37 * fVar42 * -0.5 * fVar37 + fVar37 * 1.5;
        auVar53._0_4_ = fVar52 * fVar37;
        fVar77 = fVar37 * fVar77;
        auVar41._4_4_ = (int)*(undefined8 *)(pcVar8 + lVar18 + 0x34);
        auVar41._0_4_ = *(undefined4 *)(pcVar8 + lVar18);
        auVar41._8_4_ = (int)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 0x34) >> 0x20);
        auVar41._12_4_ = fVar79 * fVar37;
        auVar45._0_8_ = CONCAT44(fVar38 * fVar37,*(undefined4 *)(pcVar8 + lVar18 + 0x3c));
        auVar45._8_4_ = 0.0;
        auVar23._8_8_ = auVar45._0_8_;
        auVar53._4_4_ = 0.0;
        auVar53._8_4_ = in_XMM4_Dc;
        in_XMM4_Dd = auVar53._0_4_;
        in_XMM6_Da = in_XMM4_Db;
        in_XMM6_Db = in_XMM4_Dc;
      }
      else if (RVar6 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
        pcVar8 = pRVar7->ptr_ofs;
        lVar18 = uVar17 * pRVar7->stride;
        auVar41 = *(undefined1 (*) [16])(pcVar8 + lVar18);
        auVar23 = *(undefined1 (*) [16])(pcVar8 + lVar18 + 0x10);
        pfVar1 = (float *)(pcVar8 + lVar18 + 0x20);
        fVar56 = *pfVar1;
        fVar78 = pfVar1[1];
        fVar58 = pfVar1[2];
        fVar77 = pfVar1[3];
        pfVar1 = (float *)(pcVar8 + lVar18 + 0x30);
        in_XMM4_Da = *pfVar1;
        in_XMM4_Db = pfVar1[1];
        in_XMM4_Dc = pfVar1[2];
        in_XMM4_Dd = pfVar1[3];
      }
      fVar37 = 1.0 - fVar36;
      a0.field_0._0_4_ = auVar41._0_4_ * fVar36;
      a0.field_0._4_4_ = auVar41._4_4_ * fVar36;
      a0.field_0._8_4_ = auVar41._8_4_ * fVar36;
      in_XMM11_Da = in_XMM11_Da * fVar37 + a0.field_0._0_4_;
      in_XMM11_Db = in_XMM11_Db * fVar37 + a0.field_0._4_4_;
      in_XMM11_Dc = in_XMM11_Dc * fVar37 + a0.field_0._8_4_;
      in_XMM11_Dd = in_XMM11_Dd * fVar37 + auVar41._12_4_ * fVar36;
      in_XMM3_Da = auVar23._0_4_ * fVar36;
      in_XMM3_Db = auVar23._4_4_ * fVar36;
      in_XMM3_Dc = auVar23._8_4_ * fVar36;
      in_XMM3_Dd = auVar23._12_4_ * fVar36;
      fVar52 = in_XMM14._4_4_;
      fVar79 = in_XMM14._8_4_;
      fVar38 = in_XMM14._12_4_;
      in_XMM14._0_4_ = in_XMM14._0_4_ * fVar37 + in_XMM3_Da;
      in_XMM14._4_4_ = fVar52 * fVar37 + in_XMM3_Db;
      in_XMM14._8_4_ = fVar79 * fVar37 + in_XMM3_Dc;
      in_XMM14._12_4_ = fVar38 * fVar37 + in_XMM3_Dd;
      in_XMM13_Da = in_XMM13_Da * fVar37 + fVar56 * fVar36;
      in_XMM13_Db = in_XMM13_Db * fVar37 + fVar78 * fVar36;
      in_XMM13_Dc = in_XMM13_Dc * fVar37 + fVar58 * fVar36;
      in_XMM13_Dd = in_XMM13_Dd * fVar37 + fVar77 * fVar36;
      in_XMM12_Da = fVar36 * in_XMM4_Da;
      in_XMM12_Db = fVar36 * in_XMM4_Db;
      fStack_204 = fVar36 * in_XMM4_Dc;
      in_XMM12_Dd = fVar36 * in_XMM4_Dd;
      in_XMM15_Da = fVar37 * auVar34._0_4_ + in_XMM12_Da;
      in_XMM15_Db = fVar37 * auVar34._4_4_ + in_XMM12_Db;
      in_XMM15_Dc = fVar37 * auVar34._8_4_ + fStack_204;
      in_XMM15_Dd = fVar37 * auVar34._12_4_ + in_XMM12_Dd;
    }
  }
  uVar17 = (ulong)prim->primID_;
  if ((this->super_Geometry).numTimeSteps == 1) {
    pRVar7 = (this->l2w_buf).items;
    RVar6 = pRVar7->format;
    if ((this->super_Geometry).field_8.field_0x1 == '\x01') {
      if (RVar6 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
        pcVar8 = pRVar7->ptr_ofs;
        lVar18 = uVar17 * pRVar7->stride;
        fVar58 = *(float *)(pcVar8 + lVar18 + 0x10);
        fVar52 = *(float *)(pcVar8 + lVar18);
        in_XMM3_Da = *(float *)(pcVar8 + lVar18 + 4);
        in_XMM6_Da = *(float *)(pcVar8 + lVar18 + 8);
        in_XMM4_Da = *(float *)(pcVar8 + lVar18 + 0xc);
        fVar77 = *(float *)(pcVar8 + lVar18 + 0x20);
        fVar56 = 0.0;
        in_XMM3_Db = *(float *)(pcVar8 + lVar18 + 0x14);
        in_XMM3_Dc = *(float *)(pcVar8 + lVar18 + 0x24);
        in_XMM3_Dd = 0.0;
        in_XMM6_Db = *(float *)(pcVar8 + lVar18 + 0x18);
        in_XMM6_Dc = *(float *)(pcVar8 + lVar18 + 0x28);
        in_XMM6_Dd = 0.0;
        in_XMM4_Db = *(float *)(pcVar8 + lVar18 + 0x1c);
        in_XMM4_Dc = *(float *)(pcVar8 + lVar18 + 0x2c);
        in_XMM4_Dd = 0.0;
      }
      else if (RVar6 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
        pcVar8 = pRVar7->ptr_ofs;
        lVar18 = uVar17 * pRVar7->stride;
        fVar52 = *(float *)(pcVar8 + lVar18);
        fVar58 = (float)*(undefined8 *)(pcVar8 + lVar18 + 4);
        fVar77 = (float)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 4) >> 0x20);
        fVar56 = 0.0;
        in_XMM3_Da = *(float *)(pcVar8 + lVar18 + 0xc);
        in_XMM3_Db = (float)*(undefined8 *)(pcVar8 + lVar18 + 0x10);
        in_XMM3_Dc = (float)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 0x10) >> 0x20);
        in_XMM3_Dd = 0.0;
        in_XMM6_Da = *(float *)(pcVar8 + lVar18 + 0x18);
        in_XMM6_Db = (float)*(undefined8 *)(pcVar8 + lVar18 + 0x1c);
        in_XMM6_Dc = (float)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 0x1c) >> 0x20);
        in_XMM6_Dd = 0.0;
        in_XMM4_Da = *(float *)(pcVar8 + lVar18 + 0x24);
        in_XMM4_Db = (float)*(undefined8 *)(pcVar8 + lVar18 + 0x28);
        in_XMM4_Dc = (float)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 0x28) >> 0x20);
        in_XMM4_Dd = 0.0;
      }
      else if (RVar6 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
        pcVar8 = pRVar7->ptr_ofs;
        lVar18 = uVar17 * pRVar7->stride;
        in_XMM6_Da = *(float *)(pcVar8 + lVar18 + 0x10);
        in_XMM6_Db = *(float *)((long)(pcVar8 + lVar18 + 0x10) + 4);
        fVar52 = *(float *)(pcVar8 + lVar18);
        in_XMM3_Db = *(float *)(pcVar8 + lVar18 + 4);
        in_XMM6_Dc = *(float *)(pcVar8 + lVar18 + 8);
        in_XMM3_Da = *(float *)(pcVar8 + lVar18 + 0xc);
        fVar58 = (float)*(undefined8 *)(pcVar8 + lVar18 + 0x34);
        fVar77 = (float)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 0x34) >> 0x20);
        in_XMM4_Da = *(float *)(pcVar8 + lVar18 + 0x18);
        in_XMM4_Dd = *(float *)(pcVar8 + lVar18 + 0x24);
        fVar56 = *(float *)(pcVar8 + lVar18 + 0x28);
        in_XMM3_Dd = *(float *)(pcVar8 + lVar18 + 0x2c);
        fVar78 = *(float *)(pcVar8 + lVar18 + 0x30);
        fVar36 = fVar78 * fVar78 +
                 in_XMM3_Dd * in_XMM3_Dd + in_XMM4_Dd * in_XMM4_Dd + fVar56 * fVar56;
        auVar23 = rsqrtss(ZEXT416((uint)fVar36),ZEXT416((uint)fVar36));
        fVar79 = auVar23._0_4_;
        in_XMM6_Dd = fVar79 * fVar79 * fVar36 * -0.5 * fVar79 + fVar79 * 1.5;
        in_XMM4_Dd = in_XMM4_Dd * in_XMM6_Dd;
        fVar56 = fVar56 * in_XMM6_Dd;
        in_XMM3_Dd = in_XMM3_Dd * in_XMM6_Dd;
        in_XMM6_Dd = in_XMM6_Dd * fVar78;
        in_XMM3_Dc = *(float *)(pcVar8 + lVar18 + 0x3c);
        in_XMM4_Dc = (float)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 0x1c) >> 0x20);
        in_XMM4_Db = (float)*(undefined8 *)(pcVar8 + lVar18 + 0x1c);
      }
      else {
        fVar52 = in_XMM11_Da;
        fVar58 = in_XMM11_Db;
        fVar77 = in_XMM11_Dc;
        fVar56 = in_XMM11_Dd;
        if (RVar6 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
          pcVar8 = pRVar7->ptr_ofs;
          lVar18 = uVar17 * pRVar7->stride;
          pfVar1 = (float *)(pcVar8 + lVar18);
          fVar52 = *pfVar1;
          fVar58 = pfVar1[1];
          fVar77 = pfVar1[2];
          fVar56 = pfVar1[3];
          pfVar1 = (float *)(pcVar8 + lVar18 + 0x10);
          in_XMM3_Da = *pfVar1;
          in_XMM3_Db = pfVar1[1];
          in_XMM3_Dc = pfVar1[2];
          in_XMM3_Dd = pfVar1[3];
          pfVar1 = (float *)(pcVar8 + lVar18 + 0x20);
          in_XMM6_Da = *pfVar1;
          in_XMM6_Db = pfVar1[1];
          in_XMM6_Dc = pfVar1[2];
          in_XMM6_Dd = pfVar1[3];
          pfVar1 = (float *)(pcVar8 + lVar18 + 0x30);
          in_XMM4_Da = *pfVar1;
          in_XMM4_Db = pfVar1[1];
          in_XMM4_Dc = pfVar1[2];
          in_XMM4_Dd = pfVar1[3];
        }
      }
      fVar43 = fVar56 * in_XMM3_Dd + in_XMM4_Dd * in_XMM6_Dd;
      fVar42 = fVar56 * in_XMM3_Dd - in_XMM4_Dd * in_XMM6_Dd;
      fVar36 = in_XMM4_Dd * in_XMM4_Dd + fVar56 * fVar56 + -in_XMM3_Dd * in_XMM3_Dd +
               -in_XMM6_Dd * in_XMM6_Dd;
      fVar79 = in_XMM4_Dd * in_XMM4_Dd - fVar56 * fVar56;
      fVar47 = in_XMM3_Dd * in_XMM3_Dd + fVar79 + -in_XMM6_Dd * in_XMM6_Dd;
      fVar78 = fVar56 * in_XMM6_Dd - in_XMM4_Dd * in_XMM3_Dd;
      fVar44 = in_XMM4_Dd * in_XMM3_Dd + fVar56 * in_XMM6_Dd;
      fVar48 = in_XMM3_Dd * in_XMM6_Dd + fVar56 * in_XMM4_Dd;
      fVar56 = in_XMM3_Dd * in_XMM6_Dd - fVar56 * in_XMM4_Dd;
      fVar43 = fVar43 + fVar43;
      fVar78 = fVar78 + fVar78;
      fVar79 = in_XMM6_Dd * in_XMM6_Dd + fVar79 + -in_XMM3_Dd * in_XMM3_Dd;
      fVar38 = fVar36 * 1.0 + fVar43 * 0.0 + fVar78 * 0.0;
      fVar37 = fVar36 * 0.0 + fVar43 * 1.0 + fVar78 * 0.0;
      fVar78 = fVar36 * 0.0 + fVar43 * 0.0 + fVar78 * 1.0;
      fVar48 = fVar48 + fVar48;
      fVar42 = fVar42 + fVar42;
      fVar36 = fVar42 * 1.0 + fVar47 * 0.0 + fVar48 * 0.0;
      fVar43 = fVar42 * 0.0 + fVar47 * 1.0 + fVar48 * 0.0;
      fVar42 = fVar42 * 0.0 + fVar47 * 0.0 + fVar48 * 1.0;
      fVar44 = fVar44 + fVar44;
      fVar56 = fVar56 + fVar56;
      fVar47 = fVar44 * 1.0 + fVar56 * 0.0 + fVar79 * 0.0;
      fVar48 = fVar44 * 0.0 + fVar56 * 1.0 + fVar79 * 0.0;
      fVar56 = fVar44 * 0.0 + fVar56 * 0.0 + fVar79 * 1.0;
      in_XMM12_Da = fVar52 * fVar38 + fVar36 * 0.0 + fVar47 * 0.0;
      in_XMM12_Db = fVar52 * fVar37 + fVar43 * 0.0 + fVar48 * 0.0;
      fStack_204 = fVar52 * fVar78 + fVar42 * 0.0 + fVar56 * 0.0;
      a0.field_0._0_4_ = in_XMM3_Da * fVar38 + in_XMM3_Db * fVar36 + fVar47 * 0.0;
      a0.field_0._4_4_ = in_XMM3_Da * fVar37 + in_XMM3_Db * fVar43 + fVar48 * 0.0;
      a0.field_0._8_4_ = in_XMM3_Da * fVar78 + in_XMM3_Db * fVar42 + fVar56 * 0.0;
      auVar21._0_4_ = in_XMM6_Da * fVar38 + in_XMM6_Db * fVar36 + in_XMM6_Dc * fVar47;
      auVar21._4_4_ = in_XMM6_Da * fVar37 + in_XMM6_Db * fVar43 + in_XMM6_Dc * fVar48;
      auVar21._8_4_ = in_XMM6_Da * fVar78 + in_XMM6_Db * fVar42 + in_XMM6_Dc * fVar56;
      auVar45._0_4_ = in_XMM4_Da * fVar38 + in_XMM4_Db * fVar36 + in_XMM4_Dc * fVar47 + fVar58 + 0.0
      ;
      auVar45._4_4_ = in_XMM4_Da * fVar37 + in_XMM4_Db * fVar43 + in_XMM4_Dc * fVar48 + fVar77 + 0.0
      ;
      auVar45._8_4_ =
           in_XMM4_Da * fVar78 + in_XMM4_Db * fVar42 + in_XMM4_Dc * fVar56 + in_XMM3_Dc + 0.0;
    }
    else if (RVar6 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
      pcVar8 = pRVar7->ptr_ofs;
      lVar18 = uVar17 * pRVar7->stride;
      in_XMM12_Db = *(float *)(pcVar8 + lVar18 + 0x10);
      in_XMM12_Da = *(float *)(pcVar8 + lVar18);
      fStack_204 = *(float *)(pcVar8 + lVar18 + 0x20);
      a0.field_0._4_4_ = (float)*(undefined4 *)(pcVar8 + lVar18 + 0x14);
      a0.field_0._0_4_ = (float)*(undefined4 *)(pcVar8 + lVar18 + 4);
      a0.field_0._8_4_ = (float)*(undefined4 *)(pcVar8 + lVar18 + 0x24);
      auVar21._4_4_ = (float)*(undefined4 *)(pcVar8 + lVar18 + 0x18);
      auVar21._0_4_ = (float)*(undefined4 *)(pcVar8 + lVar18 + 8);
      auVar21._8_4_ = (float)*(undefined4 *)(pcVar8 + lVar18 + 0x28);
      auVar45._4_4_ = (float)*(undefined4 *)(pcVar8 + lVar18 + 0x1c);
      auVar45._0_4_ = (float)*(undefined4 *)(pcVar8 + lVar18 + 0xc);
      auVar45._8_4_ = (float)*(undefined4 *)(pcVar8 + lVar18 + 0x2c);
    }
    else if (RVar6 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
      pcVar8 = pRVar7->ptr_ofs;
      lVar18 = uVar17 * pRVar7->stride;
      in_XMM12_Da = *(float *)(pcVar8 + lVar18);
      in_XMM12_Db = (float)*(undefined8 *)(pcVar8 + lVar18 + 4);
      fStack_204 = (float)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 4) >> 0x20);
      a0.field_0._4_4_ = (float)(int)*(undefined8 *)(pcVar8 + lVar18 + 0x10);
      a0.field_0._0_4_ = (float)*(undefined4 *)(pcVar8 + lVar18 + 0xc);
      a0.field_0._8_4_ = (float)(int)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 0x10) >> 0x20);
      auVar21._4_4_ = (float)(int)*(undefined8 *)(pcVar8 + lVar18 + 0x1c);
      auVar21._0_4_ = (float)*(undefined4 *)(pcVar8 + lVar18 + 0x18);
      auVar21._8_4_ = (float)(int)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 0x1c) >> 0x20);
      auVar45._4_4_ = (float)(int)*(undefined8 *)(pcVar8 + lVar18 + 0x28);
      auVar45._0_4_ = (float)*(undefined4 *)(pcVar8 + lVar18 + 0x24);
      auVar45._8_4_ = (float)(int)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 0x28) >> 0x20);
    }
    else if (RVar6 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
      pcVar8 = pRVar7->ptr_ofs;
      lVar18 = uVar17 * pRVar7->stride;
      in_XMM12_Da = *(float *)(pcVar8 + lVar18);
      auVar31._4_4_ = *(undefined4 *)(pcVar8 + lVar18 + 4);
      auVar31._0_4_ = *(undefined4 *)(pcVar8 + lVar18 + 0xc);
      fVar52 = *(float *)(pcVar8 + lVar18 + 0x2c);
      fVar58 = *(float *)(pcVar8 + lVar18 + 0x30) * *(float *)(pcVar8 + lVar18 + 0x30) +
               fVar52 * fVar52 +
               *(float *)(pcVar8 + lVar18 + 0x24) * *(float *)(pcVar8 + lVar18 + 0x24) +
               *(float *)(pcVar8 + lVar18 + 0x28) * *(float *)(pcVar8 + lVar18 + 0x28);
      auVar23 = rsqrtss(ZEXT416((uint)fVar58),ZEXT416((uint)fVar58));
      fVar56 = auVar23._0_4_;
      in_XMM12_Db = (float)*(undefined8 *)(pcVar8 + lVar18 + 0x34);
      auVar21._8_4_ = (float)*(undefined4 *)(pcVar8 + lVar18 + 8);
      auVar21._0_8_ = *(undefined8 *)(pcVar8 + lVar18 + 0x10);
      fStack_204 = (float)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 0x34) >> 0x20);
      auVar31._12_4_ = fVar52 * (fVar56 * fVar56 * fVar58 * -0.5 * fVar56 + fVar56 * 1.5);
      auVar31._8_4_ = *(undefined4 *)(pcVar8 + lVar18 + 0x3c);
      a0.field_0._0_12_ = auVar31._0_12_;
      auVar45._4_4_ = (float)(int)*(undefined8 *)(pcVar8 + lVar18 + 0x1c);
      auVar45._0_4_ = (float)*(undefined4 *)(pcVar8 + lVar18 + 0x18);
      auVar45._8_4_ = (float)(int)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 0x1c) >> 0x20);
    }
    else if (RVar6 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
      pcVar8 = pRVar7->ptr_ofs;
      lVar18 = uVar17 * pRVar7->stride;
      pfVar1 = (float *)(pcVar8 + lVar18);
      in_XMM12_Da = *pfVar1;
      in_XMM12_Db = pfVar1[1];
      fStack_204 = pfVar1[2];
      a0.field_0._0_12_ = SUB1612(*(undefined1 (*) [16])(pcVar8 + lVar18 + 0x10),0);
      auVar21 = SUB1612(*(undefined1 (*) [16])(pcVar8 + lVar18 + 0x20),0);
      auVar45 = SUB1612(*(undefined1 (*) [16])(pcVar8 + lVar18 + 0x30),0);
    }
    goto LAB_0027b4bb;
  }
  fVar52 = (this->super_Geometry).fnumTimeSegments;
  fVar50 = 0.0;
  fVar51 = 0.0;
  fVar42 = 0.0;
  fVar56 = (this->super_Geometry).time_range.lower;
  auVar39._4_8_ = 0;
  auVar39._0_4_ = fVar56;
  fVar63 = ((query->time - fVar56) / ((this->super_Geometry).time_range.upper - fVar56)) * fVar52;
  fVar58 = in_XMM11_Da;
  fVar78 = in_XMM11_Db;
  fVar77 = in_XMM11_Dc;
  fVar65 = in_XMM11_Dd;
  fVar79 = in_XMM13_Da;
  fVar48 = in_XMM13_Db;
  fVar49 = in_XMM13_Dc;
  fVar43 = in_XMM13_Dd;
  auVar82 = in_XMM14;
  fVar38 = in_XMM15_Da;
  fVar36 = in_XMM15_Db;
  fVar47 = in_XMM15_Dc;
  fVar44 = in_XMM15_Dd;
  fVar37 = fVar52;
  fVar56 = floorf(fVar63);
  fStack_214 = 0.0;
  fStack_210 = 0.0;
  fStack_20c = 0.0;
  if (fVar52 + -1.0 <= fVar56) {
    fVar56 = fVar52 + -1.0;
  }
  auVar28 = ZEXT812(0);
  if (0.0 <= fVar56) {
    auVar28._4_8_ = 0;
    auVar28._0_4_ = fVar56;
  }
  uVar15 = (uint)auVar28._0_4_;
  fVar63 = fVar63 - auVar28._0_4_;
  pRVar9 = (this->l2w_buf).items;
  pRVar7 = pRVar9 + uVar15;
  RVar6 = pRVar9[uVar15].format;
  if ((this->super_Geometry).field_8.field_0x1 != '\x01') {
    if (RVar6 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
      pcVar8 = pRVar7->ptr_ofs;
      lVar18 = pRVar7->stride * uVar17;
      in_XMM12_Db = *(float *)(pcVar8 + lVar18 + 0x10);
      in_XMM12_Da = *(float *)(pcVar8 + lVar18);
      fVar56 = *(float *)(pcVar8 + lVar18 + 8);
      fVar79 = *(float *)(pcVar8 + lVar18 + 0xc);
      fStack_204 = *(float *)(pcVar8 + lVar18 + 0x20);
      auVar28._4_4_ = *(undefined4 *)(pcVar8 + lVar18 + 0x14);
      auVar28._0_4_ = *(undefined4 *)(pcVar8 + lVar18 + 4);
      auVar28._8_4_ = *(undefined4 *)(pcVar8 + lVar18 + 0x24);
      fVar58 = *(float *)(pcVar8 + lVar18 + 0x18);
      fVar52 = *(float *)(pcVar8 + lVar18 + 0x28);
      fVar48 = *(float *)(pcVar8 + lVar18 + 0x1c);
      fVar49 = *(float *)(pcVar8 + lVar18 + 0x2c);
      auVar39._4_8_ = 0;
      auVar39._0_4_ = fVar49;
    }
    else if (RVar6 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
      pcVar8 = pRVar7->ptr_ofs;
      lVar18 = pRVar7->stride * uVar17;
      in_XMM12_Da = *(float *)(pcVar8 + lVar18);
      in_XMM12_Db = (float)*(undefined8 *)(pcVar8 + lVar18 + 4);
      fStack_204 = (float)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 4) >> 0x20);
      auVar28._4_4_ = (int)*(undefined8 *)(pcVar8 + lVar18 + 0x10);
      auVar28._0_4_ = *(undefined4 *)(pcVar8 + lVar18 + 0xc);
      auVar28._8_4_ = (int)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 0x10) >> 0x20);
      fVar56 = *(float *)(pcVar8 + lVar18 + 0x18);
      fVar58 = (float)*(undefined8 *)(pcVar8 + lVar18 + 0x1c);
      fVar52 = (float)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 0x1c) >> 0x20);
      uVar5 = *(ulong *)(pcVar8 + lVar18 + 0x28);
      auVar39._8_4_ = 0;
      auVar39._0_8_ = uVar5;
      fVar79 = *(float *)(pcVar8 + lVar18 + 0x24);
      fVar48 = (float)uVar5;
      fVar49 = (float)(uVar5 >> 0x20);
    }
    else if (RVar6 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
      pcVar8 = pRVar7->ptr_ofs;
      lVar18 = pRVar7->stride * uVar17;
      fVar56 = *(float *)(pcVar8 + lVar18 + 0x10);
      fVar58 = *(float *)((long)(pcVar8 + lVar18 + 0x10) + 4);
      in_XMM12_Db = *(float *)(pcVar8 + lVar18 + 0x34);
      fStack_204 = *(float *)((long)(pcVar8 + lVar18 + 0x34) + 4);
      in_XMM6_Dc = 0.0;
      in_XMM12_Da = *(float *)(pcVar8 + lVar18);
      fVar52 = *(float *)(pcVar8 + lVar18 + 8);
      auVar32._4_4_ = *(undefined4 *)(pcVar8 + lVar18 + 4);
      auVar32._0_4_ = *(undefined4 *)(pcVar8 + lVar18 + 0xc);
      fVar79 = *(float *)(pcVar8 + lVar18 + 0x18);
      fVar48 = *(float *)(pcVar8 + lVar18 + 0x1c);
      fVar49 = *(float *)((long)(pcVar8 + lVar18 + 0x1c) + 4);
      in_XMM4_Dc = 0.0;
      fVar77 = *(float *)(pcVar8 + lVar18 + 0x2c);
      fVar36 = *(float *)(pcVar8 + lVar18 + 0x30) * *(float *)(pcVar8 + lVar18 + 0x30) +
               fVar77 * fVar77 +
               *(float *)(pcVar8 + lVar18 + 0x24) * *(float *)(pcVar8 + lVar18 + 0x24) +
               *(float *)(pcVar8 + lVar18 + 0x28) * *(float *)(pcVar8 + lVar18 + 0x28);
      auVar23 = rsqrtss(ZEXT416((uint)fVar36),ZEXT416((uint)fVar36));
      fVar78 = auVar23._0_4_;
      auVar53._0_4_ = fVar77 * (fVar78 * fVar78 * fVar36 * -0.5 * fVar78 + fVar78 * 1.5);
      auVar53._4_8_ = 0;
      auVar39._0_8_ = CONCAT44(auVar53._0_4_,*(undefined4 *)(pcVar8 + lVar18 + 0x3c));
      auVar39._8_4_ = 0;
      auVar32._8_8_ = auVar39._0_8_;
      auVar28 = auVar32._0_12_;
      in_XMM4_Da = fVar48;
      in_XMM4_Db = fVar49;
      in_XMM6_Da = in_XMM12_Db;
      in_XMM6_Db = fStack_204;
    }
    else {
      fVar58 = extraout_XMM0_Db;
      fVar52 = extraout_XMM0_Dc;
      if (RVar6 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
        pcVar8 = pRVar7->ptr_ofs;
        lVar18 = pRVar7->stride * uVar17;
        pfVar1 = (float *)(pcVar8 + lVar18);
        in_XMM12_Da = *pfVar1;
        in_XMM12_Db = pfVar1[1];
        fStack_204 = pfVar1[2];
        auVar28 = SUB1612(*(undefined1 (*) [16])(pcVar8 + lVar18 + 0x10),0);
        pfVar1 = (float *)(pcVar8 + lVar18 + 0x20);
        fVar56 = *pfVar1;
        fVar58 = pfVar1[1];
        fVar52 = pfVar1[2];
        pfVar1 = (float *)(pcVar8 + lVar18 + 0x30);
        fVar79 = *pfVar1;
        fVar48 = pfVar1[1];
        fVar49 = pfVar1[2];
      }
    }
    pRVar7 = pRVar9 + (uVar15 + 1);
    RVar6 = pRVar9[uVar15 + 1].format;
    if (RVar6 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
      pcVar8 = pRVar7->ptr_ofs;
      lVar18 = uVar17 * pRVar7->stride;
      auVar39._4_4_ = *(undefined4 *)(pcVar8 + lVar18 + 0x10);
      auVar39._0_4_ = *(undefined4 *)(pcVar8 + lVar18);
      in_XMM6_Da = *(float *)(pcVar8 + lVar18 + 4);
      in_XMM4_Da = *(float *)(pcVar8 + lVar18 + 8);
      auVar39._8_4_ = *(undefined4 *)(pcVar8 + lVar18 + 0x20);
      in_XMM6_Db = *(float *)(pcVar8 + lVar18 + 0x14);
      in_XMM6_Dc = *(float *)(pcVar8 + lVar18 + 0x24);
      in_XMM4_Db = *(float *)(pcVar8 + lVar18 + 0x18);
      in_XMM4_Dc = *(float *)(pcVar8 + lVar18 + 0x28);
      auVar53._4_4_ = (float)*(undefined4 *)(pcVar8 + lVar18 + 0x1c);
      auVar53._0_4_ = (float)*(undefined4 *)(pcVar8 + lVar18 + 0xc);
      auVar53._8_4_ = (float)*(undefined4 *)(pcVar8 + lVar18 + 0x2c);
    }
    else if (RVar6 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
      pcVar8 = pRVar7->ptr_ofs;
      lVar18 = uVar17 * pRVar7->stride;
      auVar39._4_4_ = (int)*(undefined8 *)(pcVar8 + lVar18 + 4);
      auVar39._0_4_ = *(undefined4 *)(pcVar8 + lVar18);
      auVar39._8_4_ = (int)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 4) >> 0x20);
      in_XMM6_Da = *(float *)(pcVar8 + lVar18 + 0xc);
      in_XMM6_Db = (float)*(undefined8 *)(pcVar8 + lVar18 + 0x10);
      in_XMM6_Dc = (float)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 0x10) >> 0x20);
      in_XMM4_Da = *(float *)(pcVar8 + lVar18 + 0x18);
      in_XMM4_Db = (float)*(undefined8 *)(pcVar8 + lVar18 + 0x1c);
      in_XMM4_Dc = (float)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 0x1c) >> 0x20);
      auVar53._4_4_ = (float)(int)*(undefined8 *)(pcVar8 + lVar18 + 0x28);
      auVar53._0_4_ = (float)*(undefined4 *)(pcVar8 + lVar18 + 0x24);
      auVar53._8_4_ = (float)(int)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 0x28) >> 0x20);
    }
    else if (RVar6 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
      pcVar8 = pRVar7->ptr_ofs;
      lVar18 = uVar17 * pRVar7->stride;
      in_XMM4_Da = *(float *)(pcVar8 + lVar18 + 0x10);
      in_XMM4_Db = *(float *)((long)(pcVar8 + lVar18 + 0x10) + 4);
      in_XMM6_Db = *(float *)(pcVar8 + lVar18 + 4);
      in_XMM4_Dc = *(float *)(pcVar8 + lVar18 + 8);
      in_XMM6_Da = *(float *)(pcVar8 + lVar18 + 0xc);
      fVar77 = *(float *)(pcVar8 + lVar18 + 0x30) * *(float *)(pcVar8 + lVar18 + 0x30) +
               *(float *)(pcVar8 + lVar18 + 0x2c) * *(float *)(pcVar8 + lVar18 + 0x2c) +
               *(float *)(pcVar8 + lVar18 + 0x24) * *(float *)(pcVar8 + lVar18 + 0x24) +
               *(float *)(pcVar8 + lVar18 + 0x28) * *(float *)(pcVar8 + lVar18 + 0x28);
      rsqrtss(ZEXT416((uint)fVar77),ZEXT416((uint)fVar77));
      local_1b8._4_4_ = (undefined4)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 0x34) >> 0x20);
      auVar39._4_4_ = (int)*(undefined8 *)(pcVar8 + lVar18 + 0x34);
      auVar39._0_4_ = *(undefined4 *)(pcVar8 + lVar18);
      auVar39._8_4_ = local_1b8._4_4_;
      in_XMM6_Dc = *(float *)(pcVar8 + lVar18 + 0x3c);
      auVar53._4_4_ = (float)(int)*(undefined8 *)(pcVar8 + lVar18 + 0x1c);
      auVar53._0_4_ = (float)*(undefined4 *)(pcVar8 + lVar18 + 0x18);
      auVar53._8_4_ = (float)(int)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 0x1c) >> 0x20);
    }
    else if (RVar6 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
      pcVar8 = pRVar7->ptr_ofs;
      lVar18 = uVar17 * pRVar7->stride;
      auVar39 = SUB1612(*(undefined1 (*) [16])(pcVar8 + lVar18),0);
      pfVar1 = (float *)(pcVar8 + lVar18 + 0x10);
      in_XMM6_Da = *pfVar1;
      in_XMM6_Db = pfVar1[1];
      in_XMM6_Dc = pfVar1[2];
      pfVar1 = (float *)(pcVar8 + lVar18 + 0x20);
      in_XMM4_Da = *pfVar1;
      in_XMM4_Db = pfVar1[1];
      in_XMM4_Dc = pfVar1[2];
      auVar53 = SUB1612(*(undefined1 (*) [16])(pcVar8 + lVar18 + 0x30),0);
    }
    fVar77 = 1.0 - fVar63;
    in_XMM12_Da = in_XMM12_Da * fVar77 + auVar39._0_4_ * fVar63;
    in_XMM12_Db = in_XMM12_Db * fVar77 + auVar39._4_4_ * fVar63;
    fStack_204 = fStack_204 * fVar77 + auVar39._8_4_ * fVar63;
    a0.field_0._0_4_ = auVar28._0_4_ * fVar77 + in_XMM6_Da * fVar63;
    a0.field_0._4_4_ = auVar28._4_4_ * fVar77 + in_XMM6_Db * fVar63;
    a0.field_0._8_4_ = auVar28._8_4_ * fVar77 + in_XMM6_Dc * fVar63;
    auVar21._0_4_ = fVar56 * fVar77 + in_XMM4_Da * fVar63;
    auVar21._4_4_ = fVar58 * fVar77 + in_XMM4_Db * fVar63;
    auVar21._8_4_ = fVar52 * fVar77 + in_XMM4_Dc * fVar63;
    auVar45._0_4_ = fVar77 * fVar79 + fVar63 * auVar53._0_4_;
    auVar45._4_4_ = fVar77 * fVar48 + fVar63 * auVar53._4_4_;
    auVar45._8_4_ = fVar77 * fVar49 + fVar63 * auVar53._8_4_;
    goto LAB_0027b4bb;
  }
  if (RVar6 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
    pcVar8 = pRVar7->ptr_ofs;
    lVar18 = pRVar7->stride * uVar17;
    fStack_214 = *(float *)(pcVar8 + lVar18 + 0x10);
    fVar52 = *(float *)(pcVar8 + lVar18);
    in_XMM12_Da = *(float *)(pcVar8 + lVar18 + 4);
    fVar58 = *(float *)(pcVar8 + lVar18 + 8);
    fStack_210 = *(float *)(pcVar8 + lVar18 + 0x20);
    in_XMM12_Db = *(float *)(pcVar8 + lVar18 + 0x14);
    fStack_204 = *(float *)(pcVar8 + lVar18 + 0x24);
    fVar78 = *(float *)(pcVar8 + lVar18 + 0x18);
    fVar77 = *(float *)(pcVar8 + lVar18 + 0x28);
    auVar30._4_4_ = *(undefined4 *)(pcVar8 + lVar18 + 0x1c);
    auVar30._0_4_ = *(undefined4 *)(pcVar8 + lVar18 + 0xc);
    auVar30._8_4_ = *(undefined4 *)(pcVar8 + lVar18 + 0x2c);
LAB_0027c83b:
    in_XMM12_Dd = 0.0;
    fStack_20c = 0.0;
    fStack_1ac = 0.0;
    _local_1b8 = auVar30;
    fVar65 = 0.0;
  }
  else {
    if (RVar6 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
      pcVar8 = pRVar7->ptr_ofs;
      lVar18 = pRVar7->stride * uVar17;
      fVar52 = *(float *)(pcVar8 + lVar18);
      fStack_214 = (float)*(undefined8 *)(pcVar8 + lVar18 + 4);
      fStack_210 = (float)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 4) >> 0x20);
      in_XMM12_Da = *(float *)(pcVar8 + lVar18 + 0xc);
      in_XMM12_Db = (float)*(undefined8 *)(pcVar8 + lVar18 + 0x10);
      fStack_204 = (float)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 0x10) >> 0x20);
      fVar58 = *(float *)(pcVar8 + lVar18 + 0x18);
      fVar78 = (float)*(undefined8 *)(pcVar8 + lVar18 + 0x1c);
      fVar77 = (float)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 0x1c) >> 0x20);
      auVar30._4_4_ = (int)*(undefined8 *)(pcVar8 + lVar18 + 0x28);
      auVar30._0_4_ = *(undefined4 *)(pcVar8 + lVar18 + 0x24);
      auVar30._8_4_ = (int)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 0x28) >> 0x20);
      goto LAB_0027c83b;
    }
    if (RVar6 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
      pcVar8 = pRVar7->ptr_ofs;
      lVar18 = pRVar7->stride * uVar17;
      fVar58 = (float)*(undefined8 *)(pcVar8 + lVar18 + 0x10);
      fVar78 = (float)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 0x10) >> 0x20);
      fVar52 = *(float *)(pcVar8 + lVar18);
      in_XMM12_Db = *(float *)(pcVar8 + lVar18 + 4);
      fVar77 = *(float *)(pcVar8 + lVar18 + 8);
      in_XMM12_Da = *(float *)(pcVar8 + lVar18 + 0xc);
      fVar79 = *(float *)(pcVar8 + lVar18 + 0x18);
      fVar48 = (float)*(undefined8 *)(pcVar8 + lVar18 + 0x1c);
      fVar49 = (float)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 0x1c) >> 0x20);
      fVar43 = *(float *)(pcVar8 + lVar18 + 0x24);
      fStack_20c = *(float *)(pcVar8 + lVar18 + 0x28);
      in_XMM12_Dd = *(float *)(pcVar8 + lVar18 + 0x2c);
      fVar56 = *(float *)(pcVar8 + lVar18 + 0x30);
      fVar42 = fVar56 * fVar56 +
               in_XMM12_Dd * in_XMM12_Dd + fVar43 * fVar43 + fStack_20c * fStack_20c;
      auVar23 = rsqrtss(ZEXT416((uint)fVar42),ZEXT416((uint)fVar42));
      fVar37 = auVar23._0_4_;
      fVar65 = fVar37 * fVar37 * fVar42 * -0.5 * fVar37 + fVar37 * 1.5;
      fVar43 = fVar43 * fVar65;
      fStack_20c = fStack_20c * fVar65;
      in_XMM12_Dd = in_XMM12_Dd * fVar65;
      fVar65 = fVar65 * fVar56;
      fStack_214 = (float)*(undefined8 *)(pcVar8 + lVar18 + 0x34);
      fStack_210 = (float)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 0x34) >> 0x20);
      fStack_204 = *(float *)(pcVar8 + lVar18 + 0x3c);
      fVar50 = 0.0;
      fVar42 = 0.0;
      local_1b8._4_4_ = fVar48;
      local_1b8._0_4_ = fVar79;
      fStack_1b0 = fVar49;
      fStack_1ac = fVar43;
      fVar37 = fVar43;
      fVar51 = fVar49;
    }
    else {
      fVar52 = fVar63;
      if (RVar6 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
        pcVar8 = pRVar7->ptr_ofs;
        lVar18 = pRVar7->stride * uVar17;
        pfVar1 = (float *)(pcVar8 + lVar18);
        fVar52 = *pfVar1;
        fStack_214 = pfVar1[1];
        fStack_210 = pfVar1[2];
        fStack_20c = pfVar1[3];
        pfVar1 = (float *)(pcVar8 + lVar18 + 0x10);
        in_XMM12_Da = *pfVar1;
        in_XMM12_Db = pfVar1[1];
        fStack_204 = pfVar1[2];
        in_XMM12_Dd = pfVar1[3];
        pfVar1 = (float *)(pcVar8 + lVar18 + 0x20);
        fVar58 = *pfVar1;
        fVar78 = pfVar1[1];
        fVar77 = pfVar1[2];
        fVar65 = pfVar1[3];
        _local_1b8 = *(undefined1 (*) [16])(pcVar8 + lVar18 + 0x30);
      }
    }
  }
  pRVar7 = pRVar9 + (uVar15 + 1);
  RVar6 = pRVar9[uVar15 + 1].format;
  if (RVar6 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
    pcVar8 = pRVar7->ptr_ofs;
    lVar18 = uVar17 * pRVar7->stride;
    fVar48 = *(float *)(pcVar8 + lVar18 + 0x10);
    fVar79 = *(float *)(pcVar8 + lVar18);
    fVar38 = *(float *)(pcVar8 + lVar18 + 4);
    fVar37 = *(float *)(pcVar8 + lVar18 + 0xc);
    fVar49 = *(float *)(pcVar8 + lVar18 + 0x20);
    fVar43 = 0.0;
    fVar36 = *(float *)(pcVar8 + lVar18 + 0x14);
    fVar47 = *(float *)(pcVar8 + lVar18 + 0x24);
    fVar44 = 0.0;
    auVar82._4_4_ = *(undefined4 *)(pcVar8 + lVar18 + 0x18);
    auVar82._0_4_ = *(undefined4 *)(pcVar8 + lVar18 + 8);
    auVar82._8_4_ = *(undefined4 *)(pcVar8 + lVar18 + 0x28);
    auVar82._12_4_ = 0;
    fVar50 = *(float *)(pcVar8 + lVar18 + 0x1c);
    fVar51 = *(float *)(pcVar8 + lVar18 + 0x2c);
    fVar42 = 0.0;
  }
  else if (RVar6 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
    pcVar8 = pRVar7->ptr_ofs;
    lVar18 = uVar17 * pRVar7->stride;
    fVar79 = *(float *)(pcVar8 + lVar18);
    fVar48 = (float)*(undefined8 *)(pcVar8 + lVar18 + 4);
    fVar49 = (float)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 4) >> 0x20);
    fVar43 = 0.0;
    fVar38 = *(float *)(pcVar8 + lVar18 + 0xc);
    fVar36 = (float)*(undefined8 *)(pcVar8 + lVar18 + 0x10);
    fVar47 = (float)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 0x10) >> 0x20);
    fVar44 = 0.0;
    auVar82._4_4_ = (int)*(undefined8 *)(pcVar8 + lVar18 + 0x1c);
    auVar82._0_4_ = *(undefined4 *)(pcVar8 + lVar18 + 0x18);
    auVar82._8_4_ = (int)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 0x1c) >> 0x20);
    auVar82._12_4_ = 0;
    fVar37 = *(float *)(pcVar8 + lVar18 + 0x24);
    fVar50 = (float)*(undefined8 *)(pcVar8 + lVar18 + 0x28);
    fVar51 = (float)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 0x28) >> 0x20);
    fVar42 = 0.0;
  }
  else if (RVar6 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
    pcVar8 = pRVar7->ptr_ofs;
    lVar18 = uVar17 * pRVar7->stride;
    fVar79 = *(float *)(pcVar8 + lVar18);
    fVar36 = *(float *)(pcVar8 + lVar18 + 4);
    fVar38 = *(float *)(pcVar8 + lVar18 + 0xc);
    fVar48 = (float)*(undefined8 *)(pcVar8 + lVar18 + 0x34);
    fVar49 = (float)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 0x34) >> 0x20);
    fVar37 = *(float *)(pcVar8 + lVar18 + 0x18);
    fVar42 = *(float *)(pcVar8 + lVar18 + 0x24);
    fVar43 = *(float *)(pcVar8 + lVar18 + 0x28);
    fVar44 = *(float *)(pcVar8 + lVar18 + 0x2c);
    fVar56 = *(float *)(pcVar8 + lVar18 + 0x30);
    fVar50 = fVar56 * fVar56 + fVar44 * fVar44 + fVar42 * fVar42 + fVar43 * fVar43;
    auVar23 = rsqrtss(ZEXT416((uint)fVar50),ZEXT416((uint)fVar50));
    fVar47 = auVar23._0_4_;
    fVar47 = fVar47 * fVar47 * fVar50 * -0.5 * fVar47 + fVar47 * 1.5;
    fVar42 = fVar42 * fVar47;
    fVar43 = fVar43 * fVar47;
    fVar44 = fVar44 * fVar47;
    auVar82._8_4_ = *(undefined4 *)(pcVar8 + lVar18 + 8);
    auVar82._0_8_ = *(undefined8 *)(pcVar8 + lVar18 + 0x10);
    auVar82._12_4_ = fVar47 * fVar56;
    fVar47 = *(float *)(pcVar8 + lVar18 + 0x3c);
    fVar51 = (float)((ulong)*(undefined8 *)(pcVar8 + lVar18 + 0x1c) >> 0x20);
    fVar50 = (float)*(undefined8 *)(pcVar8 + lVar18 + 0x1c);
  }
  else if (RVar6 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
    pcVar8 = pRVar7->ptr_ofs;
    lVar18 = uVar17 * pRVar7->stride;
    pfVar1 = (float *)(pcVar8 + lVar18);
    fVar79 = *pfVar1;
    fVar48 = pfVar1[1];
    fVar49 = pfVar1[2];
    fVar43 = pfVar1[3];
    pfVar1 = (float *)(pcVar8 + lVar18 + 0x10);
    fVar38 = *pfVar1;
    fVar36 = pfVar1[1];
    fVar47 = pfVar1[2];
    fVar44 = pfVar1[3];
    auVar82 = *(undefined1 (*) [16])(pcVar8 + lVar18 + 0x20);
    pfVar1 = (float *)(pcVar8 + lVar18 + 0x30);
    fVar37 = *pfVar1;
    fVar50 = pfVar1[1];
    fVar51 = pfVar1[2];
    fVar42 = pfVar1[3];
  }
  fVar66 = auVar82._12_4_;
  fVar64 = fVar65 * fVar66 + in_XMM12_Dd * fVar44 + fVar42 * fStack_1ac + fStack_20c * fVar43;
  fVar56 = -fVar64;
  if (fVar64 < fVar56) {
    fVar44 = -fVar44;
  }
  uVar15 = (uint)-fVar66 & -(uint)(fVar64 < fVar56);
  fVar69 = ABS(fVar64);
  fVar68 = fVar56;
  if (fVar56 <= fVar64) {
    fVar68 = fVar64;
  }
  fVar70 = 1.0 - fVar69;
  if (fVar70 < 0.0) {
    local_b8 = fVar69;
    fStack_b4 = ABS(fVar65);
    fStack_b0 = ABS(fVar65);
    fStack_ac = ABS(fVar65);
    local_a8 = uVar15;
    uStack_a4 = (uint)-fVar66 & (uint)fVar65;
    uStack_a0 = (uint)-fVar66 & (uint)fVar65;
    uStack_9c = (uint)-fVar66 & (uint)fVar65;
    fVar70 = sqrtf(fVar70);
    uVar15 = local_a8;
    fVar19 = local_b8;
  }
  else {
    fVar70 = SQRT(fVar70);
    fVar19 = fVar69;
  }
  fVar66 = (float)(~-(uint)(fVar64 < fVar56) & (uint)fVar66 | uVar15);
  fVar69 = 1.5707964 -
           fVar70 * (((((fVar69 * -0.0043095737 + 0.0192803) * fVar69 + -0.04489909) * fVar69 +
                      0.08785567) * fVar69 + -0.21450998) * fVar69 + 1.5707952);
  fVar56 = 0.0;
  if (0.0 <= fVar69) {
    fVar56 = fVar69;
  }
  fVar56 = (float)(-(uint)(1.0 < fVar19) & 0x7fc00000 |
                  ~-(uint)(1.0 < fVar19) &
                  (uint)(1.5707964 -
                        (float)((uint)-fVar56 & -(uint)(fVar68 < 0.0) |
                               ~-(uint)(fVar68 < 0.0) & (uint)fVar56))) * fVar63;
  fVar70 = floorf(fVar56 * 0.63661975);
  fVar56 = fVar56 - fVar70 * 1.5707964;
  fVar69 = fVar56 * fVar56;
  uVar15 = (int)fVar70 & 3;
  fVar19 = ((((fVar69 * -2.5963018e-07 + 2.4756235e-05) * fVar69 + -0.001388833) * fVar69 +
            0.04166664) * fVar69 + -0.5) * fVar69 + 1.0;
  fVar56 = (((((fVar69 * -2.5029328e-08 + 2.7600126e-06) * fVar69 + -0.00019842605) * fVar69 +
             0.008333348) * fVar69 + -0.16666667) * fVar69 + 1.0) * fVar56;
  fVar69 = fVar19;
  if (((int)fVar70 & 1U) != 0) {
    fVar69 = fVar56;
    fVar56 = fVar19;
  }
  if (uVar15 - 1 < 2) {
    fVar69 = -fVar69;
  }
  fVar70 = fVar68 * in_XMM12_Dd - fVar44;
  fVar19 = fVar68 * fVar65 - fVar66;
  if (uVar15 < 2) {
    fVar56 = -fVar56;
  }
  fVar20 = 1.0 - fVar63;
  fVar26 = fVar20 * in_XMM12_Dd + fVar44 * fVar63;
  fVar44 = fVar20 * fVar65 + fVar66 * fVar63;
  uVar15 = (int)((uint)(fVar64 < 0.0) << 0x1f) >> 0x1f;
  uVar57 = (int)((uint)(fVar64 < 0.0) << 0x1f) >> 0x1f;
  fVar66 = (float)((uint)-fVar42 & uVar15 | ~uVar15 & (uint)fVar42);
  fVar67 = (float)((uint)-fVar43 & uVar57 | ~uVar57 & (uint)fVar43);
  fVar42 = fVar68 * fStack_1ac - fVar66;
  fVar43 = fVar68 * fStack_20c - fVar67;
  auVar75._0_8_ = CONCAT44(fVar65,fVar19) ^ 0x8000000000000000;
  auVar75._8_4_ = -fVar65;
  auVar75._12_4_ = -fVar65;
  auVar76._4_12_ = auVar75._4_12_;
  auVar76._0_4_ = fVar19 * fVar19 + fVar70 * fVar70 + fVar42 * fVar42 + fVar43 * fVar43;
  auVar62._0_8_ = CONCAT44(fVar65,auVar76._0_4_) ^ 0x8000000000000000;
  auVar62._8_4_ = -fVar65;
  auVar62._12_4_ = -fVar65;
  auVar23 = rsqrtss(auVar62,auVar76);
  fVar64 = auVar23._0_4_;
  fVar59 = fVar64 * fVar64 * auVar76._0_4_ * -0.5 * fVar64 + fVar64 * 1.5;
  fVar64 = fStack_1ac * fVar20 + fVar66 * fVar63;
  fVar66 = fStack_20c * fVar20 + fVar67 * fVar63;
  fVar80 = fVar44 * fVar44 + fVar26 * fVar26 + fVar64 * fVar64 + fVar66 * fVar66;
  auVar23 = rsqrtss(ZEXT416((uint)fVar80),ZEXT416((uint)fVar80));
  fVar67 = auVar23._0_4_;
  fVar67 = fVar67 * fVar67 * fVar80 * -0.5 * fVar67 + fVar67 * 1.5;
  uVar15 = (int)((uint)(0.9995 < fVar68) << 0x1f) >> 0x1f;
  uVar57 = (int)((uint)(0.9995 < fVar68) << 0x1f) >> 0x1f;
  fVar42 = (float)(~uVar15 & (uint)(fVar69 * fStack_1ac + fVar56 * fVar59 * fVar42) |
                  (uint)(fVar67 * fVar64) & uVar15);
  fVar43 = (float)(~uVar57 & (uint)(fVar69 * fStack_20c + fVar56 * fVar59 * fVar43) |
                  (uint)(fVar67 * fVar66) & uVar57);
  if (0.9995 < fVar68) {
    fVar26 = fVar26 * fVar67;
    fVar44 = fVar44 * fVar67;
  }
  else {
    fVar26 = in_XMM12_Dd * fVar69 + fVar70 * fVar59 * fVar56;
    fVar44 = fVar65 * fVar69 + fVar19 * fVar59 * fVar56;
  }
  fVar64 = fVar52 * fVar20 + fVar79 * fVar63;
  fVar65 = fStack_204 * fVar20;
  fVar79 = in_XMM12_Da * fVar20 + fVar38 * fVar63;
  fVar36 = in_XMM12_Db * fVar20 + fVar36 * fVar63;
  local_f8 = auVar82._0_4_;
  fStack_f4 = auVar82._4_4_;
  fStack_f0 = auVar82._8_4_;
  fVar66 = fVar58 * fVar20 + local_f8 * fVar63;
  fVar68 = fVar78 * fVar20 + fStack_f4 * fVar63;
  fVar69 = fVar77 * fVar20 + fStack_f0 * fVar63;
  fVar58 = (float)local_1b8._0_4_ * fVar20 + fVar37 * fVar63;
  fVar77 = (float)local_1b8._4_4_ * fVar20 + fVar50 * fVar63;
  fVar78 = fStack_1b0 * fVar20 + fVar51 * fVar63;
  fVar70 = fVar43 * fVar26 + fVar42 * fVar44;
  fVar50 = fVar43 * fVar26 - fVar42 * fVar44;
  fVar38 = fVar42 * fVar42 + fVar43 * fVar43 + -fVar26 * fVar26 + -fVar44 * fVar44;
  fVar52 = fVar42 * fVar42 - fVar43 * fVar43;
  fVar19 = fVar26 * fVar26 + fVar52 + -fVar44 * fVar44;
  fVar67 = fVar43 * fVar44 - fVar42 * fVar26;
  fVar51 = fVar42 * fVar26 + fVar43 * fVar44;
  fVar59 = fVar26 * fVar44 + fVar42 * fVar43;
  fVar56 = fVar26 * fVar44 - fVar42 * fVar43;
  fVar70 = fVar70 + fVar70;
  fVar67 = fVar67 + fVar67;
  fVar52 = fVar44 * fVar44 + fVar52 + -fVar26 * fVar26;
  fVar37 = fVar38 * 1.0 + fVar70 * 0.0 + fVar67 * 0.0;
  fVar42 = fVar38 * 0.0 + fVar70 * 1.0 + fVar67 * 0.0;
  fVar38 = fVar38 * 0.0 + fVar70 * 0.0 + fVar67 * 1.0;
  fVar59 = fVar59 + fVar59;
  fVar50 = fVar50 + fVar50;
  fVar43 = fVar50 * 1.0 + fVar19 * 0.0 + fVar59 * 0.0;
  fVar44 = fVar50 * 0.0 + fVar19 * 1.0 + fVar59 * 0.0;
  fVar50 = fVar50 * 0.0 + fVar19 * 0.0 + fVar59 * 1.0;
  fVar51 = fVar51 + fVar51;
  fVar56 = fVar56 + fVar56;
  fVar70 = fVar51 * 1.0 + fVar56 * 0.0 + fVar52 * 0.0;
  fVar19 = fVar51 * 0.0 + fVar56 * 1.0 + fVar52 * 0.0;
  fVar52 = fVar51 * 0.0 + fVar56 * 0.0 + fVar52 * 1.0;
  in_XMM12_Da = fVar64 * fVar37 + fVar43 * 0.0 + fVar70 * 0.0;
  in_XMM12_Db = fVar64 * fVar42 + fVar44 * 0.0 + fVar19 * 0.0;
  fStack_204 = fVar64 * fVar38 + fVar50 * 0.0 + fVar52 * 0.0;
  a0.field_0._0_4_ = fVar79 * fVar37 + fVar36 * fVar43 + fVar70 * 0.0;
  a0.field_0._4_4_ = fVar79 * fVar42 + fVar36 * fVar44 + fVar19 * 0.0;
  a0.field_0._8_4_ = fVar79 * fVar38 + fVar36 * fVar50 + fVar52 * 0.0;
  auVar21._0_4_ = fVar66 * fVar37 + fVar68 * fVar43 + fVar69 * fVar70;
  auVar21._4_4_ = fVar66 * fVar42 + fVar68 * fVar44 + fVar69 * fVar19;
  auVar21._8_4_ = fVar66 * fVar38 + fVar68 * fVar50 + fVar69 * fVar52;
  auVar45._0_4_ =
       fVar58 * fVar37 + fVar77 * fVar43 + fVar78 * fVar70 +
       fStack_214 * fVar20 + fVar48 * fVar63 + 0.0;
  auVar45._4_4_ =
       fVar58 * fVar42 + fVar77 * fVar44 + fVar78 * fVar19 +
       fStack_210 * fVar20 + fVar49 * fVar63 + 0.0;
  auVar45._8_4_ =
       fVar58 * fVar38 + fVar77 * fVar50 + fVar78 * fVar52 + fVar65 + fVar47 * fVar63 + 0.0;
LAB_0027b4bb:
  fVar52 = auVar21._0_4_;
  fVar56 = auVar21._4_4_;
  fVar58 = auVar21._8_4_;
  fVar77 = a0.field_0._0_4_;
  fVar78 = a0.field_0._4_4_;
  fVar79 = a0.field_0._8_4_;
  auVar33._0_4_ = fVar77 * fVar56 - fVar52 * fVar78;
  fVar36 = fVar78 * fVar58 - fVar56 * fVar79;
  fVar38 = fVar79 * fVar52 - fVar58 * fVar77;
  auVar22._4_4_ = fVar56 * fStack_204 - fVar58 * in_XMM12_Db;
  auVar33._4_4_ = fVar52 * in_XMM12_Db - fVar56 * in_XMM12_Da;
  auVar33._8_4_ = fVar78 * in_XMM12_Da - in_XMM12_Db * fVar77;
  auVar33._12_4_ = 0;
  auVar22._0_4_ = fVar36;
  auVar22._8_4_ = fVar79 * in_XMM12_Db - fStack_204 * fVar78;
  auVar22._12_4_ = 0;
  auVar40._4_4_ = fVar58 * in_XMM12_Da - fVar52 * fStack_204;
  auVar40._0_4_ = fVar38;
  auVar40._8_4_ = fVar77 * fStack_204 - in_XMM12_Da * fVar79;
  auVar40._12_4_ = 0;
  auVar81._0_4_ = fStack_204 * auVar33._0_4_ + in_XMM12_Db * fVar38 + in_XMM12_Da * fVar36;
  auVar81._4_4_ = auVar81._0_4_;
  auVar81._8_4_ = auVar81._0_4_;
  auVar81._12_4_ = auVar81._0_4_;
  auVar23 = divps(auVar22,auVar81);
  auVar41 = divps(auVar40,auVar81);
  auVar34 = divps(auVar33,auVar81);
  fVar47 = auVar45._0_4_;
  fVar48 = auVar45._4_4_;
  fVar49 = auVar45._8_4_;
  fVar77 = auVar34._0_4_;
  fVar78 = auVar34._4_4_;
  fVar79 = auVar34._8_4_;
  fVar36 = auVar41._0_4_;
  fVar38 = auVar41._4_4_;
  fVar37 = auVar41._8_4_;
  fVar52 = auVar23._0_4_;
  fVar56 = auVar23._4_4_;
  fVar58 = auVar23._8_4_;
  fVar42 = fVar47 * fVar52 + fVar48 * fVar36 + fVar49 * fVar77;
  fVar43 = fVar47 * fVar56 + fVar48 * fVar38 + fVar49 * fVar78;
  fVar44 = fVar47 * fVar58 + fVar48 * fVar37 + fVar49 * fVar79;
  local_80 = 2;
  bVar13 = true;
  local_68 = 0.0;
  if ((((context->query_type == POINT_QUERY_TYPE_SPHERE) &&
       (ABS(fVar58 * fVar37 + fVar56 * fVar38 + fVar52 * fVar36) <= 1e-05)) &&
      (ABS(fVar58 * fVar79 + fVar56 * fVar78 + fVar52 * fVar77) <= 1e-05)) &&
     (ABS(fVar37 * fVar79 + fVar38 * fVar78 + fVar36 * fVar77) <= 1e-05)) {
    fVar50 = fVar58 * fVar58 + fVar56 * fVar56 + fVar52 * fVar52;
    fVar51 = fVar37 * fVar37 + fVar38 * fVar38 + fVar36 * fVar36;
    if (((ABS(fVar50 - fVar51) <= 1e-05) &&
        (fVar65 = fVar79 * fVar79 + fVar78 * fVar78 + fVar77 * fVar77, ABS(fVar50 - fVar65) <= 1e-05
        )) && (ABS(fVar51 - fVar65) <= 1e-05)) {
      local_68 = SQRT(fVar50);
      local_80 = 1;
      bVar13 = false;
    }
  }
  pRVar10 = context->userContext;
  uVar15 = pRVar10->instStackSize;
  *(ulong *)(pRVar10->instID + uVar15) = CONCAT44((*prim).primID_,(*prim).instID_);
  *(undefined1 (*) [16])pRVar10->world2inst[uVar15] = auVar23;
  *(undefined1 (*) [16])(pRVar10->world2inst[uVar15] + 4) = auVar41;
  *(undefined1 (*) [16])(pRVar10->world2inst[uVar15] + 8) = auVar34;
  pfVar1 = pRVar10->world2inst[uVar15] + 0xc;
  *pfVar1 = -fVar42;
  pfVar1[1] = -fVar43;
  pfVar1[2] = -fVar44;
  pfVar1[3] = -(fVar47 * auVar23._12_4_ + fVar48 * auVar41._12_4_ + fVar49 * auVar34._12_4_);
  pafVar2 = pRVar10->inst2world + uVar15;
  (*pafVar2)[0] = in_XMM11_Da;
  (*pafVar2)[1] = in_XMM11_Db;
  (*pafVar2)[2] = in_XMM11_Dc;
  (*pafVar2)[3] = in_XMM11_Dd;
  *(undefined1 (*) [16])(pRVar10->inst2world[uVar15] + 4) = in_XMM14;
  pfVar1 = pRVar10->inst2world[uVar15] + 8;
  *pfVar1 = in_XMM13_Da;
  pfVar1[1] = in_XMM13_Db;
  pfVar1[2] = in_XMM13_Dc;
  pfVar1[3] = in_XMM13_Dd;
  pfVar1 = pRVar10->inst2world[uVar15] + 0xc;
  *pfVar1 = in_XMM15_Da;
  pfVar1[1] = in_XMM15_Db;
  pfVar1[2] = in_XMM15_Dc;
  pfVar1[3] = in_XMM15_Dd;
  pRVar10->instStackSize = pRVar10->instStackSize + 1;
  local_cc = query->time;
  fVar47 = (query->p).field_0.field_0.x;
  fVar48 = (query->p).field_0.field_0.y;
  fVar49 = (query->p).field_0.field_0.z;
  local_d8 = CONCAT44(fVar47 * fVar56 + fVar48 * fVar38 + (fVar49 * fVar78 - fVar43),
                      fVar47 * fVar52 + fVar48 * fVar36 + (fVar49 * fVar77 - fVar42));
  local_d0 = fVar47 * fVar58 + fVar48 * fVar37 + (fVar49 * fVar79 - fVar44);
  local_c8 = query->radius * local_68;
  local_88 = context->query_ws;
  local_78 = context->func;
  local_70 = context->userContext;
  local_60 = context->userPtr;
  local_90 = 0;
  local_58 = 0xffffffffffffffff;
  local_48 = local_88->radius;
  if (bVar13) {
    fStack_44 = local_48;
    fStack_40 = local_48;
    fStack_3c = local_48;
    if ((local_48 < INFINITY) && (local_70->instStackSize != 0)) {
      uVar15 = local_70->instStackSize - 1;
      pafVar2 = local_70->world2inst + uVar15;
      pfVar1 = local_70->world2inst[uVar15] + 4;
      pfVar3 = local_70->world2inst[uVar15] + 8;
      pfVar4 = local_70->world2inst[uVar15] + 0xc;
      fVar38 = *pfVar4 - *pfVar3 * local_48;
      fVar37 = pfVar4[1] - pfVar3[1] * local_48;
      fVar42 = pfVar4[2] - pfVar3[2] * local_48;
      fVar43 = pfVar4[3] - pfVar3[3] * local_48;
      fVar44 = -local_48 * *pfVar1;
      fVar47 = -local_48 * pfVar1[1];
      fVar48 = -local_48 * pfVar1[2];
      fVar49 = -local_48 * pfVar1[3];
      fVar51 = fVar44 + fVar38;
      fVar65 = fVar47 + fVar37;
      fVar63 = fVar48 + fVar42;
      fVar64 = fVar49 + fVar43;
      fVar52 = -local_48 * (*pafVar2)[0];
      fVar56 = -local_48 * (*pafVar2)[1];
      fVar58 = -local_48 * (*pafVar2)[2];
      fVar50 = -local_48 * (*pafVar2)[3];
      fVar77 = fVar52 + fVar51;
      fVar78 = fVar56 + fVar65;
      fVar79 = fVar58 + fVar63;
      fVar36 = fVar50 + fVar64;
      auVar11._4_4_ = fVar78;
      auVar11._0_4_ = fVar77;
      auVar11._8_4_ = fVar79;
      auVar11._12_4_ = fVar36;
      auVar23 = minps(_DAT_01f45a30,auVar11);
      auVar12._4_4_ = fVar78;
      auVar12._0_4_ = fVar77;
      auVar12._8_4_ = fVar79;
      auVar12._12_4_ = fVar36;
      auVar34 = maxps(_DAT_01f45a40,auVar12);
      fVar66 = *pfVar3 * local_48 + *pfVar4;
      fVar68 = pfVar3[1] * local_48 + pfVar4[1];
      fVar69 = pfVar3[2] * local_48 + pfVar4[2];
      fVar70 = pfVar3[3] * local_48 + pfVar4[3];
      fVar44 = fVar44 + fVar66;
      fVar47 = fVar47 + fVar68;
      fVar48 = fVar48 + fVar69;
      fVar49 = fVar49 + fVar70;
      auVar71._0_4_ = fVar52 + fVar44;
      auVar71._4_4_ = fVar56 + fVar47;
      auVar71._8_4_ = fVar58 + fVar48;
      auVar71._12_4_ = fVar50 + fVar49;
      auVar23 = minps(auVar23,auVar71);
      auVar34 = maxps(auVar34,auVar71);
      fVar77 = *pfVar1 * local_48;
      fVar78 = pfVar1[1] * local_48;
      fVar79 = pfVar1[2] * local_48;
      fVar36 = pfVar1[3] * local_48;
      fVar38 = fVar38 + fVar77;
      fVar37 = fVar37 + fVar78;
      fVar42 = fVar42 + fVar79;
      fVar43 = fVar43 + fVar36;
      auVar72._0_4_ = fVar52 + fVar38;
      auVar72._4_4_ = fVar56 + fVar37;
      auVar72._8_4_ = fVar58 + fVar42;
      auVar72._12_4_ = fVar50 + fVar43;
      auVar23 = minps(auVar23,auVar72);
      auVar34 = maxps(auVar34,auVar72);
      fVar77 = fVar77 + fVar66;
      fVar78 = fVar78 + fVar68;
      fVar79 = fVar79 + fVar69;
      fVar36 = fVar36 + fVar70;
      auVar55._0_4_ = fVar52 + fVar77;
      auVar55._4_4_ = fVar56 + fVar78;
      auVar55._8_4_ = fVar58 + fVar79;
      auVar55._12_4_ = fVar50 + fVar36;
      auVar23 = minps(auVar23,auVar55);
      auVar34 = maxps(auVar34,auVar55);
      fVar52 = local_48 * (*pafVar2)[0];
      fVar56 = local_48 * (*pafVar2)[1];
      fVar58 = local_48 * (*pafVar2)[2];
      local_48 = local_48 * (*pafVar2)[3];
      auVar60._0_4_ = fVar51 + fVar52;
      auVar60._4_4_ = fVar65 + fVar56;
      auVar60._8_4_ = fVar63 + fVar58;
      auVar60._12_4_ = fVar64 + local_48;
      auVar23 = minps(auVar23,auVar60);
      auVar34 = maxps(auVar34,auVar60);
      auVar46._0_4_ = fVar44 + fVar52;
      auVar46._4_4_ = fVar47 + fVar56;
      auVar46._8_4_ = fVar48 + fVar58;
      auVar46._12_4_ = fVar49 + local_48;
      auVar23 = minps(auVar23,auVar46);
      auVar34 = maxps(auVar34,auVar46);
      auVar35._0_4_ = fVar38 + fVar52;
      auVar35._4_4_ = fVar37 + fVar56;
      auVar35._8_4_ = fVar42 + fVar58;
      auVar35._12_4_ = fVar43 + local_48;
      auVar23 = minps(auVar23,auVar35);
      auVar34 = maxps(auVar34,auVar35);
      auVar24._0_4_ = fVar52 + fVar77;
      auVar24._4_4_ = fVar56 + fVar78;
      auVar24._8_4_ = fVar58 + fVar79;
      auVar24._12_4_ = local_48 + fVar36;
      auVar23 = minps(auVar23,auVar24);
      auVar34 = maxps(auVar34,auVar24);
      local_48 = (auVar34._0_4_ - auVar23._0_4_) * 0.5;
      fStack_44 = (auVar34._4_4_ - auVar23._4_4_) * 0.5;
      fStack_40 = (auVar34._8_4_ - auVar23._8_4_) * 0.5;
      fStack_3c = (auVar34._12_4_ - auVar23._12_4_) * 0.5;
    }
  }
  else {
    local_48 = local_68 * local_48;
    fStack_44 = local_48;
    fStack_40 = local_48;
    fStack_3c = local_48;
  }
  local_98 = pAVar16;
  uVar14 = (**(code **)&pAVar16->field_0x88)(&(pAVar16->super_AccelData).field_0x58,&local_d8);
  pRVar10 = context->userContext;
  uVar15 = pRVar10->instStackSize - 1;
  pRVar10->instStackSize = uVar15;
  pRVar10->instID[uVar15] = 0xffffffff;
  pRVar10->instPrimID[pRVar10->instStackSize] = 0xffffffff;
  return (bool)uVar14;
}

Assistant:

bool InstanceArrayIntersector1MB::pointQuery(PointQuery* query, PointQueryContext* context, const Primitive& prim)
    {
      const InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return false;

      const AffineSpace3fa local2world = instance->getLocal2World(prim.primID_, query->time);
      const AffineSpace3fa world2local = instance->getWorld2Local(prim.primID_, query->time);
      float similarityScale = 0.f;
      const bool similtude = context->query_type == POINT_QUERY_TYPE_SPHERE
                           && similarityTransform(world2local, &similarityScale);

      if (likely(instance_id_stack::push(context->userContext, prim.instID_, prim.primID_, world2local, local2world)))
      {
        PointQuery query_inst;
        query_inst.time = query->time;
        query_inst.p = xfmPoint(world2local, query->p); 
        query_inst.radius = query->radius * similarityScale;

        PointQueryContext context_inst(
          (Scene*)object, 
          context->query_ws, 
          similtude ? POINT_QUERY_TYPE_SPHERE : POINT_QUERY_TYPE_AABB,
          context->func, 
          context->userContext,
          similarityScale,
          context->userPtr); 

        bool changed = object->intersectors.pointQuery(&query_inst, &context_inst);
        instance_id_stack::pop(context->userContext);
        return changed;
      }
      return false;
    }